

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  RTCFeatureFlags RVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  int iVar53;
  ulong uVar54;
  RTCFilterFunctionN p_Var55;
  RayHitK<4> *pRVar56;
  RTCIntersectArguments *pRVar57;
  int iVar58;
  undefined4 uVar59;
  RTCIntersectArguments *pRVar60;
  ulong uVar61;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  short sVar74;
  undefined2 uVar112;
  float fVar75;
  float fVar76;
  float fVar113;
  float fVar115;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar114;
  float fVar116;
  undefined8 uVar117;
  float fVar118;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  float fVar151;
  float fVar153;
  vfloat4 v_2;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar156;
  float fVar167;
  float fVar169;
  vfloat4 v;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar157;
  float fVar168;
  float fVar170;
  float fVar171;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar172;
  float fVar189;
  float fVar192;
  vfloat4 v_1;
  undefined1 auVar174 [16];
  float fVar173;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar197;
  float fVar198;
  float fVar206;
  float fVar208;
  undefined1 auVar199 [16];
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar212;
  float fVar234;
  float fVar236;
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar239;
  float fVar240;
  float fVar244;
  float fVar246;
  undefined1 auVar241 [16];
  float fVar245;
  float fVar247;
  float fVar248;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  float fVar250;
  float fVar257;
  float fVar259;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar256 [16];
  float fVar262;
  float fVar265;
  float fVar266;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar267;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar281 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar292;
  float fVar293;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar303;
  float fVar304;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar319;
  float fVar320;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar329;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined8 uStack_380;
  Precalculations *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  RTCFilterFunctionNArguments local_338;
  undefined1 local_308 [8];
  float fStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 *local_2d0;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  LinearSpace3fa *local_218;
  Primitive *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  uint local_1d8;
  int local_1d4;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  float local_178 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [4];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [12];
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 uVar111;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  
  PVar17 = prim[1];
  uVar54 = (ulong)(byte)PVar17;
  lVar22 = uVar54 * 0x25;
  pPVar7 = prim + lVar22 + 6;
  fVar169 = *(float *)(pPVar7 + 0xc);
  fVar172 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar169;
  fVar189 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar169;
  fVar192 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar169;
  fVar156 = *(float *)(ray + k * 4 + 0x40) * fVar169;
  fVar167 = *(float *)(ray + k * 4 + 0x50) * fVar169;
  fVar169 = *(float *)(ray + k * 4 + 0x60) * fVar169;
  uVar59 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar65;
  auVar77._12_2_ = uVar112;
  auVar77._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar159._12_4_ = auVar77._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar65;
  auVar159._10_2_ = uVar112;
  auVar272._10_6_ = auVar159._10_6_;
  auVar272._8_2_ = uVar112;
  auVar272._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar28._4_8_ = auVar272._8_8_;
  auVar28._2_2_ = uVar112;
  auVar28._0_2_ = uVar112;
  fVar319 = (float)((int)sVar74 >> 8);
  fVar326 = (float)(auVar28._0_4_ >> 0x18);
  fVar327 = (float)(auVar272._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar65;
  auVar123._12_2_ = uVar112;
  auVar123._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar65;
  auVar122._10_2_ = uVar112;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar112;
  auVar121._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar29._4_8_ = auVar121._8_8_;
  auVar29._2_2_ = uVar112;
  auVar29._0_2_ = uVar112;
  fVar197 = (float)((int)sVar74 >> 8);
  fVar206 = (float)(auVar29._0_4_ >> 0x18);
  fVar208 = (float)(auVar121._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar65;
  auVar126._12_2_ = uVar112;
  auVar126._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar65;
  auVar125._10_2_ = uVar112;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar112;
  auVar124._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar30._4_8_ = auVar124._8_8_;
  auVar30._2_2_ = uVar112;
  auVar30._0_2_ = uVar112;
  fVar239 = (float)((int)sVar74 >> 8);
  fVar244 = (float)(auVar30._0_4_ >> 0x18);
  fVar246 = (float)(auVar124._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar65;
  auVar129._12_2_ = uVar112;
  auVar129._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar65;
  auVar128._10_2_ = uVar112;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar112;
  auVar127._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar31._4_8_ = auVar127._8_8_;
  auVar31._2_2_ = uVar112;
  auVar31._0_2_ = uVar112;
  fVar75 = (float)((int)sVar74 >> 8);
  fVar113 = (float)(auVar31._0_4_ >> 0x18);
  fVar115 = (float)(auVar127._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar65;
  auVar215._12_2_ = uVar112;
  auVar215._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar65;
  auVar214._10_2_ = uVar112;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar112;
  auVar213._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar32._4_8_ = auVar213._8_8_;
  auVar32._2_2_ = uVar112;
  auVar32._0_2_ = uVar112;
  fVar249 = (float)((int)sVar74 >> 8);
  fVar257 = (float)(auVar32._0_4_ >> 0x18);
  fVar259 = (float)(auVar213._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar54 + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar65;
  auVar218._12_2_ = uVar112;
  auVar218._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar65;
  auVar217._10_2_ = uVar112;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar112;
  auVar216._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar33._4_8_ = auVar216._8_8_;
  auVar33._2_2_ = uVar112;
  auVar33._0_2_ = uVar112;
  fVar267 = (float)((int)sVar74 >> 8);
  fVar274 = (float)(auVar33._0_4_ >> 0x18);
  fVar276 = (float)(auVar216._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar65;
  auVar221._12_2_ = uVar112;
  auVar221._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar65;
  auVar220._10_2_ = uVar112;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar112;
  auVar219._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar34._4_8_ = auVar219._8_8_;
  auVar34._2_2_ = uVar112;
  auVar34._0_2_ = uVar112;
  fVar262 = (float)((int)sVar74 >> 8);
  fVar265 = (float)(auVar34._0_4_ >> 0x18);
  fVar266 = (float)(auVar219._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar65;
  auVar224._12_2_ = uVar112;
  auVar224._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar65;
  auVar223._10_2_ = uVar112;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar112;
  auVar222._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar35._4_8_ = auVar222._8_8_;
  auVar35._2_2_ = uVar112;
  auVar35._0_2_ = uVar112;
  fVar279 = (float)((int)sVar74 >> 8);
  fVar288 = (float)(auVar35._0_4_ >> 0x18);
  fVar290 = (float)(auVar222._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar111 = (undefined1)((uint)uVar59 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar59 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar59));
  uVar111 = (undefined1)((uint)uVar59 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar59,(char)uVar59);
  uVar65 = CONCAT62(uVar27,sVar74);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar65;
  auVar227._12_2_ = uVar112;
  auVar227._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar65;
  auVar226._10_2_ = uVar112;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar112;
  auVar225._0_8_ = uVar65;
  uVar112 = (undefined2)uVar27;
  auVar36._4_8_ = auVar225._8_8_;
  auVar36._2_2_ = uVar112;
  auVar36._0_2_ = uVar112;
  fVar119 = (float)((int)sVar74 >> 8);
  fVar151 = (float)(auVar36._0_4_ >> 0x18);
  fVar153 = (float)(auVar225._8_4_ >> 0x18);
  fVar303 = fVar156 * fVar319 + fVar167 * fVar197 + fVar169 * fVar239;
  fVar313 = fVar156 * fVar326 + fVar167 * fVar206 + fVar169 * fVar244;
  fVar315 = fVar156 * fVar327 + fVar167 * fVar208 + fVar169 * fVar246;
  fVar317 = fVar156 * (float)(auVar159._12_4_ >> 0x18) +
            fVar167 * (float)(auVar122._12_4_ >> 0x18) + fVar169 * (float)(auVar125._12_4_ >> 0x18);
  fVar293 = fVar156 * fVar75 + fVar167 * fVar249 + fVar169 * fVar267;
  fVar300 = fVar156 * fVar113 + fVar167 * fVar257 + fVar169 * fVar274;
  fVar301 = fVar156 * fVar115 + fVar167 * fVar259 + fVar169 * fVar276;
  fVar302 = fVar156 * (float)(auVar128._12_4_ >> 0x18) +
            fVar167 * (float)(auVar214._12_4_ >> 0x18) + fVar169 * (float)(auVar217._12_4_ >> 0x18);
  fVar211 = fVar156 * fVar262 + fVar167 * fVar279 + fVar169 * fVar119;
  fVar234 = fVar156 * fVar265 + fVar167 * fVar288 + fVar169 * fVar151;
  fVar236 = fVar156 * fVar266 + fVar167 * fVar290 + fVar169 * fVar153;
  fVar156 = fVar156 * (float)(auVar220._12_4_ >> 0x18) +
            fVar167 * (float)(auVar223._12_4_ >> 0x18) + fVar169 * (float)(auVar226._12_4_ >> 0x18);
  fVar320 = fVar319 * fVar172 + fVar197 * fVar189 + fVar239 * fVar192;
  fVar326 = fVar326 * fVar172 + fVar206 * fVar189 + fVar244 * fVar192;
  fVar327 = fVar327 * fVar172 + fVar208 * fVar189 + fVar246 * fVar192;
  fVar328 = (float)(auVar159._12_4_ >> 0x18) * fVar172 +
            (float)(auVar122._12_4_ >> 0x18) * fVar189 + (float)(auVar125._12_4_ >> 0x18) * fVar192;
  fVar267 = fVar75 * fVar172 + fVar249 * fVar189 + fVar267 * fVar192;
  fVar274 = fVar113 * fVar172 + fVar257 * fVar189 + fVar274 * fVar192;
  fVar276 = fVar115 * fVar172 + fVar259 * fVar189 + fVar276 * fVar192;
  fVar319 = (float)(auVar128._12_4_ >> 0x18) * fVar172 +
            (float)(auVar214._12_4_ >> 0x18) * fVar189 + (float)(auVar217._12_4_ >> 0x18) * fVar192;
  fVar262 = fVar172 * fVar262 + fVar189 * fVar279 + fVar192 * fVar119;
  fVar265 = fVar172 * fVar265 + fVar189 * fVar288 + fVar192 * fVar151;
  fVar266 = fVar172 * fVar266 + fVar189 * fVar290 + fVar192 * fVar153;
  fVar279 = fVar172 * (float)(auVar220._12_4_ >> 0x18) +
            fVar189 * (float)(auVar223._12_4_ >> 0x18) + fVar192 * (float)(auVar226._12_4_ >> 0x18);
  fVar169 = (float)DAT_01ff1d40;
  fVar75 = DAT_01ff1d40._4_4_;
  fVar113 = DAT_01ff1d40._8_4_;
  fVar115 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar169 <= ABS(fVar303));
  uVar67 = -(uint)(fVar75 <= ABS(fVar313));
  uVar69 = -(uint)(fVar113 <= ABS(fVar315));
  uVar71 = -(uint)(fVar115 <= ABS(fVar317));
  auVar305._0_4_ = (uint)fVar303 & uVar66;
  auVar305._4_4_ = (uint)fVar313 & uVar67;
  auVar305._8_4_ = (uint)fVar315 & uVar69;
  auVar305._12_4_ = (uint)fVar317 & uVar71;
  auVar174._0_4_ = ~uVar66 & (uint)fVar169;
  auVar174._4_4_ = ~uVar67 & (uint)fVar75;
  auVar174._8_4_ = ~uVar69 & (uint)fVar113;
  auVar174._12_4_ = ~uVar71 & (uint)fVar115;
  auVar174 = auVar174 | auVar305;
  uVar66 = -(uint)(fVar169 <= ABS(fVar293));
  uVar67 = -(uint)(fVar75 <= ABS(fVar300));
  uVar69 = -(uint)(fVar113 <= ABS(fVar301));
  uVar71 = -(uint)(fVar115 <= ABS(fVar302));
  auVar294._0_4_ = (uint)fVar293 & uVar66;
  auVar294._4_4_ = (uint)fVar300 & uVar67;
  auVar294._8_4_ = (uint)fVar301 & uVar69;
  auVar294._12_4_ = (uint)fVar302 & uVar71;
  auVar241._0_4_ = ~uVar66 & (uint)fVar169;
  auVar241._4_4_ = ~uVar67 & (uint)fVar75;
  auVar241._8_4_ = ~uVar69 & (uint)fVar113;
  auVar241._12_4_ = ~uVar71 & (uint)fVar115;
  auVar241 = auVar241 | auVar294;
  uVar66 = -(uint)(fVar169 <= ABS(fVar211));
  uVar67 = -(uint)(fVar75 <= ABS(fVar234));
  uVar69 = -(uint)(fVar113 <= ABS(fVar236));
  uVar71 = -(uint)(fVar115 <= ABS(fVar156));
  auVar228._0_4_ = (uint)fVar211 & uVar66;
  auVar228._4_4_ = (uint)fVar234 & uVar67;
  auVar228._8_4_ = (uint)fVar236 & uVar69;
  auVar228._12_4_ = (uint)fVar156 & uVar71;
  auVar251._0_4_ = ~uVar66 & (uint)fVar169;
  auVar251._4_4_ = ~uVar67 & (uint)fVar75;
  auVar251._8_4_ = ~uVar69 & (uint)fVar113;
  auVar251._12_4_ = ~uVar71 & (uint)fVar115;
  auVar251 = auVar251 | auVar228;
  auVar77 = rcpps(_DAT_01ff1d40,auVar174);
  fVar169 = auVar77._0_4_;
  fVar115 = auVar77._4_4_;
  fVar197 = auVar77._8_4_;
  fVar249 = auVar77._12_4_;
  fVar169 = (1.0 - auVar174._0_4_ * fVar169) * fVar169 + fVar169;
  fVar115 = (1.0 - auVar174._4_4_ * fVar115) * fVar115 + fVar115;
  fVar197 = (1.0 - auVar174._8_4_ * fVar197) * fVar197 + fVar197;
  fVar249 = (1.0 - auVar174._12_4_ * fVar249) * fVar249 + fVar249;
  auVar77 = rcpps(auVar77,auVar241);
  fVar75 = auVar77._0_4_;
  fVar119 = auVar77._4_4_;
  fVar206 = auVar77._8_4_;
  fVar257 = auVar77._12_4_;
  fVar75 = (1.0 - auVar241._0_4_ * fVar75) * fVar75 + fVar75;
  fVar119 = (1.0 - auVar241._4_4_ * fVar119) * fVar119 + fVar119;
  fVar206 = (1.0 - auVar241._8_4_ * fVar206) * fVar206 + fVar206;
  fVar257 = (1.0 - auVar241._12_4_ * fVar257) * fVar257 + fVar257;
  auVar77 = rcpps(auVar77,auVar251);
  fVar113 = auVar77._0_4_;
  fVar151 = auVar77._4_4_;
  fVar208 = auVar77._8_4_;
  fVar259 = auVar77._12_4_;
  fVar113 = (1.0 - auVar251._0_4_ * fVar113) * fVar113 + fVar113;
  fVar151 = (1.0 - auVar251._4_4_ * fVar151) * fVar151 + fVar151;
  fVar208 = (1.0 - auVar251._8_4_ * fVar208) * fVar208 + fVar208;
  fVar259 = (1.0 - auVar251._12_4_ * fVar259) * fVar259 + fVar259;
  fVar288 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar65 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar112 = (undefined2)(uVar65 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar65;
  auVar80._12_2_ = uVar112;
  auVar80._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar65 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar65;
  auVar79._10_2_ = uVar112;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar112;
  auVar78._0_8_ = uVar65;
  uVar112 = (undefined2)(uVar65 >> 0x10);
  auVar37._4_8_ = auVar78._8_8_;
  auVar37._2_2_ = uVar112;
  auVar37._0_2_ = uVar112;
  fVar153 = (float)(auVar37._0_4_ >> 0x10);
  fVar211 = (float)(auVar78._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar112 = (undefined2)(uVar63 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar63;
  auVar177._12_2_ = uVar112;
  auVar177._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar63 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar63;
  auVar176._10_2_ = uVar112;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar112;
  auVar175._0_8_ = uVar63;
  uVar112 = (undefined2)(uVar63 >> 0x10);
  auVar38._4_8_ = auVar175._8_8_;
  auVar38._2_2_ = uVar112;
  auVar38._0_2_ = uVar112;
  uVar9 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar112 = (undefined2)(uVar9 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar9;
  auVar83._12_2_ = uVar112;
  auVar83._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar9 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar9;
  auVar82._10_2_ = uVar112;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar112;
  auVar81._0_8_ = uVar9;
  uVar112 = (undefined2)(uVar9 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar112;
  auVar39._0_2_ = uVar112;
  fVar156 = (float)(auVar39._0_4_ >> 0x10);
  fVar234 = (float)(auVar81._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar112 = (undefined2)(uVar10 >> 0x30);
  auVar254._8_4_ = 0;
  auVar254._0_8_ = uVar10;
  auVar254._12_2_ = uVar112;
  auVar254._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar10 >> 0x20);
  auVar253._12_4_ = auVar254._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar10;
  auVar253._10_2_ = uVar112;
  auVar252._10_6_ = auVar253._10_6_;
  auVar252._8_2_ = uVar112;
  auVar252._0_8_ = uVar10;
  uVar112 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar252._8_8_;
  auVar40._2_2_ = uVar112;
  auVar40._0_2_ = uVar112;
  uVar11 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar112 = (undefined2)(uVar11 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar11;
  auVar86._12_2_ = uVar112;
  auVar86._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar11 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar11;
  auVar85._10_2_ = uVar112;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar112;
  auVar84._0_8_ = uVar11;
  uVar112 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar84._8_8_;
  auVar41._2_2_ = uVar112;
  auVar41._0_2_ = uVar112;
  fVar167 = (float)(auVar41._0_4_ >> 0x10);
  fVar236 = (float)(auVar84._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar54 * 2 + uVar61 + 6);
  uVar112 = (undefined2)(uVar12 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar12;
  auVar270._12_2_ = uVar112;
  auVar270._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar12 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar12;
  auVar269._10_2_ = uVar112;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar112;
  auVar268._0_8_ = uVar12;
  uVar112 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar268._8_8_;
  auVar42._2_2_ = uVar112;
  auVar42._0_2_ = uVar112;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar112 = (undefined2)(uVar61 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar61;
  auVar89._12_2_ = uVar112;
  auVar89._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar61 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar61;
  auVar88._10_2_ = uVar112;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar112;
  auVar87._0_8_ = uVar61;
  uVar112 = (undefined2)(uVar61 >> 0x10);
  auVar43._4_8_ = auVar87._8_8_;
  auVar43._2_2_ = uVar112;
  auVar43._0_2_ = uVar112;
  fVar172 = (float)(auVar43._0_4_ >> 0x10);
  fVar239 = (float)(auVar87._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar112 = (undefined2)(uVar13 >> 0x30);
  auVar283._8_4_ = 0;
  auVar283._0_8_ = uVar13;
  auVar283._12_2_ = uVar112;
  auVar283._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar13 >> 0x20);
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._8_2_ = 0;
  auVar282._0_8_ = uVar13;
  auVar282._10_2_ = uVar112;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._8_2_ = uVar112;
  auVar281._0_8_ = uVar13;
  uVar112 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar281._8_8_;
  auVar44._2_2_ = uVar112;
  auVar44._0_2_ = uVar112;
  uVar14 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar112 = (undefined2)(uVar14 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar14;
  auVar92._12_2_ = uVar112;
  auVar92._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar14 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar14;
  auVar91._10_2_ = uVar112;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar112;
  auVar90._0_8_ = uVar14;
  uVar112 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar90._8_8_;
  auVar45._2_2_ = uVar112;
  auVar45._0_2_ = uVar112;
  fVar189 = (float)(auVar45._0_4_ >> 0x10);
  fVar244 = (float)(auVar90._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar112 = (undefined2)(uVar15 >> 0x30);
  auVar297._8_4_ = 0;
  auVar297._0_8_ = uVar15;
  auVar297._12_2_ = uVar112;
  auVar297._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar15 >> 0x20);
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._8_2_ = 0;
  auVar296._0_8_ = uVar15;
  auVar296._10_2_ = uVar112;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._8_2_ = uVar112;
  auVar295._0_8_ = uVar15;
  uVar112 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar295._8_8_;
  auVar46._2_2_ = uVar112;
  auVar46._0_2_ = uVar112;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar54) + 6);
  uVar112 = (undefined2)(uVar16 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar16;
  auVar95._12_2_ = uVar112;
  auVar95._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar16 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar16;
  auVar94._10_2_ = uVar112;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar112;
  auVar93._0_8_ = uVar16;
  uVar112 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar93._8_8_;
  auVar47._2_2_ = uVar112;
  auVar47._0_2_ = uVar112;
  fVar192 = (float)(auVar47._0_4_ >> 0x10);
  fVar246 = (float)(auVar93._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar112 = (undefined2)(uVar54 >> 0x30);
  auVar308._8_4_ = 0;
  auVar308._0_8_ = uVar54;
  auVar308._12_2_ = uVar112;
  auVar308._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar54 >> 0x20);
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar54;
  auVar307._10_2_ = uVar112;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._8_2_ = uVar112;
  auVar306._0_8_ = uVar54;
  uVar112 = (undefined2)(uVar54 >> 0x10);
  auVar48._4_8_ = auVar306._8_8_;
  auVar48._2_2_ = uVar112;
  auVar48._0_2_ = uVar112;
  auVar178._0_8_ =
       CONCAT44(((((float)(auVar38._0_4_ >> 0x10) - fVar153) * fVar288 + fVar153) - fVar326) *
                fVar115,((((float)(int)(short)uVar63 - (float)(int)(short)uVar65) * fVar288 +
                         (float)(int)(short)uVar65) - fVar320) * fVar169);
  auVar178._8_4_ =
       ((((float)(auVar175._8_4_ >> 0x10) - fVar211) * fVar288 + fVar211) - fVar327) * fVar197;
  auVar178._12_4_ =
       ((((float)(auVar176._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar328) * fVar249;
  auVar255._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar288 + (float)(int)(short)uVar9
        ) - fVar320) * fVar169;
  auVar255._4_4_ =
       ((((float)(auVar40._0_4_ >> 0x10) - fVar156) * fVar288 + fVar156) - fVar326) * fVar115;
  auVar255._8_4_ =
       ((((float)(auVar252._8_4_ >> 0x10) - fVar234) * fVar288 + fVar234) - fVar327) * fVar197;
  auVar255._12_4_ =
       ((((float)(auVar253._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar328) * fVar249;
  auVar271._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar167) * fVar288 + fVar167) - fVar274) *
                fVar119,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar288 +
                         (float)(int)(short)uVar11) - fVar267) * fVar75);
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar236) * fVar288 + fVar236) - fVar276) * fVar206;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar319) * fVar257;
  auVar284._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar61) * fVar288 +
        (float)(int)(short)uVar61) - fVar267) * fVar75;
  auVar284._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar172) * fVar288 + fVar172) - fVar274) * fVar119;
  auVar284._8_4_ =
       ((((float)(auVar281._8_4_ >> 0x10) - fVar239) * fVar288 + fVar239) - fVar276) * fVar206;
  auVar284._12_4_ =
       ((((float)(auVar282._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar319) * fVar257;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar298._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar189) * fVar288 + fVar189) - fVar265) *
                fVar151,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar288 +
                         (float)(int)(short)uVar14) - fVar262) * fVar113);
  auVar298._8_4_ =
       ((((float)(auVar295._8_4_ >> 0x10) - fVar244) * fVar288 + fVar244) - fVar266) * fVar208;
  auVar298._12_4_ =
       ((((float)(auVar296._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar279) * fVar259;
  auVar309._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar16) * fVar288 +
        (float)(int)(short)uVar16) - fVar262) * fVar113;
  auVar309._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar192) * fVar288 + fVar192) - fVar265) * fVar151;
  auVar309._8_4_ =
       ((((float)(auVar306._8_4_ >> 0x10) - fVar246) * fVar288 + fVar246) - fVar266) * fVar208;
  auVar309._12_4_ =
       ((((float)(auVar307._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar279) * fVar259;
  auVar158._8_4_ = auVar178._8_4_;
  auVar158._0_8_ = auVar178._0_8_;
  auVar158._12_4_ = auVar178._12_4_;
  auVar159 = minps(auVar158,auVar255);
  auVar130._8_4_ = auVar271._8_4_;
  auVar130._0_8_ = auVar271._0_8_;
  auVar130._12_4_ = auVar271._12_4_;
  auVar77 = minps(auVar130,auVar284);
  auVar159 = maxps(auVar159,auVar77);
  auVar131._8_4_ = auVar298._8_4_;
  auVar131._0_8_ = auVar298._0_8_;
  auVar131._12_4_ = auVar298._12_4_;
  auVar77 = minps(auVar131,auVar309);
  auVar96._4_4_ = uVar59;
  auVar96._0_4_ = uVar59;
  auVar96._8_4_ = uVar59;
  auVar96._12_4_ = uVar59;
  auVar77 = maxps(auVar77,auVar96);
  auVar77 = maxps(auVar159,auVar77);
  auVar159 = maxps(auVar178,auVar255);
  auVar272 = maxps(auVar271,auVar284);
  auVar159 = minps(auVar159,auVar272);
  local_48 = auVar77._0_4_ * 0.99999964;
  fStack_44 = auVar77._4_4_ * 0.99999964;
  fStack_40 = auVar77._8_4_ * 0.99999964;
  fStack_3c = auVar77._12_4_ * 0.99999964;
  auVar77 = maxps(auVar298,auVar309);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar59;
  auVar97._0_4_ = uVar59;
  auVar97._8_4_ = uVar59;
  auVar97._12_4_ = uVar59;
  auVar77 = minps(auVar77,auVar97);
  auVar77 = minps(auVar159,auVar77);
  uVar66 = (uint)(byte)PVar17;
  auVar132._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar77._0_4_ * 1.0000004);
  auVar132._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar77._4_4_ * 1.0000004);
  auVar132._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar77._8_4_ * 1.0000004);
  auVar132._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar77._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar132);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_218 = pre->ray_space + k;
    local_368 = mm_lookupmask_ps._0_8_;
    uStack_360 = mm_lookupmask_ps._8_8_;
    local_2d0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_370 = pre;
    local_210 = prim;
    do {
      lVar22 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      uVar67 = *(uint *)(local_210 + 2);
      pRVar62 = (RTCIntersectArguments *)(ulong)uVar67;
      uVar69 = *(uint *)(local_210 + lVar22 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[(long)pRVar62].ptr;
      uVar65 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               (ulong)uVar69 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar169 = pGVar19->fnumTimeSegments;
      fVar75 = (pGVar19->time_range).lower;
      fVar113 = ((*(float *)(ray + k * 4 + 0x70) - fVar75) / ((pGVar19->time_range).upper - fVar75))
                * fVar169;
      fVar75 = floorf(fVar113);
      fVar169 = fVar169 + -1.0;
      if (fVar169 <= fVar75) {
        fVar75 = fVar169;
      }
      fVar169 = 0.0;
      if (0.0 <= fVar75) {
        fVar169 = fVar75;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar63 = (long)(int)fVar169 * 0x38;
      lVar22 = *(long *)(_Var20 + 0x10 + uVar63);
      lVar64 = *(long *)(_Var20 + 0x38 + uVar63);
      lVar21 = *(long *)(_Var20 + 0x48 + uVar63);
      pfVar1 = (float *)(lVar64 + uVar65 * lVar21);
      pfVar2 = (float *)(lVar64 + (uVar65 + 1) * lVar21);
      pfVar3 = (float *)(lVar64 + (uVar65 + 2) * lVar21);
      fVar113 = fVar113 - fVar169;
      fVar169 = 1.0 - fVar113;
      pfVar4 = (float *)(lVar64 + lVar21 * (uVar65 + 3));
      lVar64 = *(long *)(_Var20 + uVar63);
      pfVar5 = (float *)(lVar64 + lVar22 * uVar65);
      pfVar6 = (float *)(lVar64 + lVar22 * (uVar65 + 1));
      local_358 = *pfVar5 * fVar169 + *pfVar1 * fVar113;
      fStack_354 = pfVar5[1] * fVar169 + pfVar1[1] * fVar113;
      fStack_350 = pfVar5[2] * fVar169 + pfVar1[2] * fVar113;
      fStack_34c = pfVar5[3] * fVar169 + pfVar1[3] * fVar113;
      fVar274 = *pfVar6 * fVar169 + *pfVar2 * fVar113;
      fVar276 = pfVar6[1] * fVar169 + pfVar2[1] * fVar113;
      fVar319 = pfVar6[2] * fVar169 + pfVar2[2] * fVar113;
      fStack_29c = pfVar6[3] * fVar169 + pfVar2[3] * fVar113;
      pfVar1 = (float *)(lVar64 + lVar22 * (uVar65 + 2));
      fVar246 = *pfVar1 * fVar169 + *pfVar3 * fVar113;
      fVar249 = pfVar1[1] * fVar169 + pfVar3[1] * fVar113;
      fVar257 = pfVar1[2] * fVar169 + pfVar3[2] * fVar113;
      fStack_2ac = pfVar1[3] * fVar169 + pfVar3[3] * fVar113;
      pfVar1 = (float *)(lVar64 + lVar22 * (uVar65 + 3));
      fVar236 = fVar169 * *pfVar1 + fVar113 * *pfVar4;
      fVar239 = fVar169 * pfVar1[1] + fVar113 * pfVar4[1];
      fVar244 = fVar169 * pfVar1[2] + fVar113 * pfVar4[2];
      fStack_28c = fVar169 * pfVar1[3] + fVar113 * pfVar4[3];
      iVar18 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar169 = *(float *)(ray + k * 4);
      fVar75 = *(float *)(ray + k * 4 + 0x10);
      fVar113 = *(float *)(ray + k * 4 + 0x20);
      fVar197 = local_358 - fVar169;
      fVar206 = fStack_354 - fVar75;
      fVar208 = fStack_350 - fVar113;
      fVar115 = (local_218->vx).field_0.m128[0];
      fVar119 = (local_218->vx).field_0.m128[1];
      fVar151 = (local_218->vx).field_0.m128[2];
      fVar153 = (local_218->vy).field_0.m128[0];
      fVar156 = (local_218->vy).field_0.m128[1];
      fVar167 = (local_218->vy).field_0.m128[2];
      fVar172 = (local_218->vz).field_0.m128[0];
      fVar189 = (local_218->vz).field_0.m128[1];
      fVar192 = (local_218->vz).field_0.m128[2];
      local_268 = fVar197 * fVar115 + fVar206 * fVar153 + fVar208 * fVar172;
      local_278 = fVar197 * fVar119 + fVar206 * fVar156 + fVar208 * fVar189;
      fVar211 = fVar197 * fVar151 + fVar206 * fVar167 + fVar208 * fVar192;
      fVar197 = fVar274 - fVar169;
      fVar206 = fVar276 - fVar75;
      fVar208 = fVar319 - fVar113;
      local_2f8 = fVar197 * fVar115 + fVar206 * fVar153 + fVar208 * fVar172;
      local_348 = fVar197 * fVar119 + fVar206 * fVar156 + fVar208 * fVar189;
      fVar234 = fVar197 * fVar151 + fVar206 * fVar167 + fVar208 * fVar192;
      fVar197 = fVar246 - fVar169;
      fVar206 = fVar249 - fVar75;
      fVar208 = fVar257 - fVar113;
      fVar259 = fVar197 * fVar115 + fVar206 * fVar153 + fVar208 * fVar172;
      fVar267 = fVar197 * fVar119 + fVar206 * fVar156 + fVar208 * fVar189;
      local_248 = fVar197 * fVar151 + fVar206 * fVar167 + fVar208 * fVar192;
      fVar169 = fVar236 - fVar169;
      fVar75 = fVar239 - fVar75;
      fVar113 = fVar244 - fVar113;
      local_2e8 = fVar169 * fVar115 + fVar75 * fVar153 + fVar113 * fVar172;
      fVar115 = fVar169 * fVar119 + fVar75 * fVar156 + fVar113 * fVar189;
      local_258 = fVar169 * fVar151 + fVar75 * fVar167 + fVar113 * fVar192;
      auVar285._0_8_ = CONCAT44(local_278,local_268) & 0x7fffffff7fffffff;
      auVar285._8_4_ = ABS(fVar211);
      auVar285._12_4_ = ABS(fStack_34c);
      auVar199._0_8_ = CONCAT44(local_348,local_2f8) & 0x7fffffff7fffffff;
      auVar199._8_4_ = ABS(fVar234);
      auVar199._12_4_ = ABS(fStack_29c);
      auVar159 = maxps(auVar285,auVar199);
      auVar229._0_8_ = CONCAT44(fVar267,fVar259) & 0x7fffffff7fffffff;
      auVar229._8_4_ = ABS(local_248);
      auVar229._12_4_ = ABS(fStack_2ac);
      auVar133._0_8_ = CONCAT44(fVar115,local_2e8) & 0x7fffffff7fffffff;
      auVar133._8_4_ = ABS(local_258);
      auVar133._12_4_ = ABS(fStack_28c);
      auVar77 = maxps(auVar229,auVar133);
      auVar77 = maxps(auVar159,auVar77);
      uVar117 = auVar77._8_8_;
      fVar169 = auVar77._4_4_;
      if (auVar77._4_4_ <= auVar77._0_4_) {
        fVar169 = auVar77._0_4_;
      }
      auVar286._8_8_ = uVar117;
      auVar286._0_8_ = uVar117;
      fVar75 = (float)iVar18;
      _local_2c8 = ZEXT416((uint)fVar75);
      if (auVar77._8_4_ <= fVar169) {
        auVar287._4_12_ = auVar286._4_12_;
        auVar287._0_4_ = fVar169;
        uVar117 = auVar287._0_8_;
      }
      pRVar60 = (RTCIntersectArguments *)((long)iVar18 * 0x40);
      uVar59 = SUB84(pRVar60,0);
      lVar22 = (long)iVar18 * 0x44;
      pauVar8 = (undefined1 (*) [16])(catmullrom_basis0 + lVar22 + 0x908);
      fVar169 = *(float *)*pauVar8;
      fVar113 = *(float *)(catmullrom_basis0 + lVar22 + 0x90c);
      fVar119 = *(float *)(catmullrom_basis0 + lVar22 + 0x910);
      auVar28 = *(undefined1 (*) [12])*pauVar8;
      fVar151 = *(float *)(catmullrom_basis0 + lVar22 + 0x914);
      fVar153 = *(float *)(catmullrom_basis0 + lVar22 + 0xd8c);
      fVar156 = *(float *)(catmullrom_basis0 + lVar22 + 0xd90);
      fVar167 = *(float *)(catmullrom_basis0 + lVar22 + 0xd94);
      fVar172 = *(float *)(catmullrom_basis0 + lVar22 + 0xd98);
      fVar189 = *(float *)(catmullrom_basis0 + lVar22 + 0x484);
      fVar192 = *(float *)(catmullrom_basis0 + lVar22 + 0x488);
      fVar197 = *(float *)(catmullrom_basis0 + lVar22 + 0x48c);
      fVar206 = *(float *)(catmullrom_basis0 + lVar22 + 0x490);
      fVar208 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar22);
      fVar262 = *(float *)(catmullrom_basis0 + lVar22 + 4);
      fVar265 = *(float *)(catmullrom_basis0 + lVar22 + 8);
      auVar29 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar22);
      fVar266 = *(float *)(catmullrom_basis0 + lVar22 + 0xc);
      fVar250 = local_268 * fVar208 + local_2f8 * fVar189 + fVar259 * fVar169 + local_2e8 * fVar153;
      fVar258 = local_268 * fVar262 + local_2f8 * fVar192 + fVar259 * fVar113 + local_2e8 * fVar156;
      fVar260 = local_268 * fVar265 + local_2f8 * fVar197 + fVar259 * fVar119 + local_2e8 * fVar167;
      fVar261 = local_268 * fVar266 + local_2f8 * fVar206 + fVar259 * fVar151 + local_2e8 * fVar172;
      fVar173 = local_278 * fVar208 + local_348 * fVar189 + fVar267 * fVar169 + fVar115 * fVar153;
      fVar190 = local_278 * fVar262 + local_348 * fVar192 + fVar267 * fVar113 + fVar115 * fVar156;
      fVar193 = local_278 * fVar265 + local_348 * fVar197 + fVar267 * fVar119 + fVar115 * fVar167;
      fVar195 = local_278 * fVar266 + local_348 * fVar206 + fVar267 * fVar151 + fVar115 * fVar172;
      fVar313 = fStack_34c * fVar208 +
                fStack_29c * fVar189 + fStack_2ac * fVar169 + fStack_28c * fVar153;
      fVar317 = fStack_34c * fVar262 +
                fStack_29c * fVar192 + fStack_2ac * fVar113 + fStack_28c * fVar156;
      auVar263._4_4_ = fVar317;
      auVar263._0_4_ = fVar313;
      fVar326 = fStack_34c * fVar265 +
                fStack_29c * fVar197 + fStack_2ac * fVar119 + fStack_28c * fVar167;
      fVar328 = fStack_34c * fVar266 +
                fStack_29c * fVar206 + fStack_2ac * fVar151 + fStack_28c * fVar172;
      fVar113 = *(float *)(catmullrom_basis1 + lVar22 + 0xd8c);
      fVar119 = *(float *)(catmullrom_basis1 + lVar22 + 0xd90);
      fVar208 = *(float *)(catmullrom_basis1 + lVar22 + 0xd94);
      fVar262 = *(float *)(catmullrom_basis1 + lVar22 + 0xd98);
      local_228 = *(float *)(catmullrom_basis1 + lVar22 + 0x908);
      fStack_224 = *(float *)(catmullrom_basis1 + lVar22 + 0x90c);
      fStack_220 = *(float *)(catmullrom_basis1 + lVar22 + 0x910);
      fStack_21c = *(float *)(catmullrom_basis1 + lVar22 + 0x914);
      local_128 = fStack_28c;
      fStack_124 = fStack_28c;
      fStack_120 = fStack_28c;
      fStack_11c = fStack_28c;
      local_118 = fStack_2ac;
      fStack_114 = fStack_2ac;
      fStack_110 = fStack_2ac;
      fStack_10c = fStack_2ac;
      fVar265 = *(float *)(catmullrom_basis1 + lVar22 + 0x484);
      fVar279 = *(float *)(catmullrom_basis1 + lVar22 + 0x488);
      fVar288 = *(float *)(catmullrom_basis1 + lVar22 + 0x48c);
      fVar290 = *(float *)(catmullrom_basis1 + lVar22 + 0x490);
      local_138 = fStack_29c;
      fStack_134 = fStack_29c;
      fStack_130 = fStack_29c;
      fStack_12c = fStack_29c;
      fVar293 = *(float *)(catmullrom_basis1 + lVar22);
      fVar300 = *(float *)(catmullrom_basis1 + lVar22 + 4);
      fVar301 = *(float *)(catmullrom_basis1 + lVar22 + 8);
      fVar302 = *(float *)(catmullrom_basis1 + lVar22 + 0xc);
      fVar240 = local_268 * fVar293 +
                local_2f8 * fVar265 + fVar259 * local_228 + local_2e8 * fVar113;
      fVar245 = local_268 * fVar300 +
                local_2f8 * fVar279 + fVar259 * fStack_224 + local_2e8 * fVar119;
      fVar247 = local_268 * fVar301 +
                local_2f8 * fVar288 + fVar259 * fStack_220 + local_2e8 * fVar208;
      fVar248 = local_268 * fVar302 +
                local_2f8 * fVar290 + fVar259 * fStack_21c + local_2e8 * fVar262;
      fVar303 = local_278 * fVar293 + local_348 * fVar265 + fVar267 * local_228 + fVar115 * fVar113;
      fVar315 = local_278 * fVar300 + local_348 * fVar279 + fVar267 * fStack_224 + fVar115 * fVar119
      ;
      fVar320 = local_278 * fVar301 + local_348 * fVar288 + fVar267 * fStack_220 + fVar115 * fVar208
      ;
      fVar327 = local_278 * fVar302 + local_348 * fVar290 + fVar267 * fStack_21c + fVar115 * fVar262
      ;
      local_148 = fStack_34c;
      fStack_144 = fStack_34c;
      fStack_140 = fStack_34c;
      fStack_13c = fStack_34c;
      fVar335 = fStack_34c * fVar293 +
                fStack_29c * fVar265 + fStack_2ac * local_228 + fStack_28c * fVar113;
      fVar337 = fStack_34c * fVar300 +
                fStack_29c * fVar279 + fStack_2ac * fStack_224 + fStack_28c * fVar119;
      fVar339 = fStack_34c * fVar301 +
                fStack_29c * fVar288 + fStack_2ac * fStack_220 + fStack_28c * fVar208;
      fVar341 = fStack_34c * fVar302 +
                fStack_29c * fVar290 + fStack_2ac * fStack_21c + fStack_28c * fVar262;
      fVar212 = fVar240 - fVar250;
      fVar235 = fVar245 - fVar258;
      fVar237 = fVar247 - fVar260;
      fVar238 = fVar248 - fVar261;
      fVar198 = fVar303 - fVar173;
      fVar207 = fVar315 - fVar190;
      fVar209 = fVar320 - fVar193;
      fVar210 = fVar327 - fVar195;
      fVar169 = fVar173 * fVar212 - fVar250 * fVar198;
      fVar191 = fVar190 * fVar235 - fVar258 * fVar207;
      fVar194 = fVar193 * fVar237 - fVar260 * fVar209;
      fVar196 = fVar195 * fVar238 - fVar261 * fVar210;
      auVar263._8_4_ = fVar326;
      auVar263._12_4_ = fVar328;
      auVar23._4_4_ = fVar337;
      auVar23._0_4_ = fVar335;
      auVar23._8_4_ = fVar339;
      auVar23._12_4_ = fVar341;
      auVar77 = maxps(auVar263,auVar23);
      bVar51 = fVar169 * fVar169 <=
               auVar77._0_4_ * auVar77._0_4_ * (fVar212 * fVar212 + fVar198 * fVar198) &&
               0.0 < fVar75;
      auVar179._0_4_ = -(uint)bVar51;
      bVar52 = fVar191 * fVar191 <=
               auVar77._4_4_ * auVar77._4_4_ * (fVar235 * fVar235 + fVar207 * fVar207) &&
               1.0 < fVar75;
      auVar179._4_4_ = -(uint)bVar52;
      bVar50 = fVar194 * fVar194 <=
               auVar77._8_4_ * auVar77._8_4_ * (fVar237 * fVar237 + fVar209 * fVar209) &&
               2.0 < fVar75;
      auVar179._8_4_ = -(uint)bVar50;
      bVar49 = fVar196 * fVar196 <=
               auVar77._12_4_ * auVar77._12_4_ * (fVar238 * fVar238 + fVar210 * fVar210) &&
               3.0 < fVar75;
      auVar179._12_4_ = -(uint)bVar49;
      local_448 = (float)uVar117;
      local_448 = local_448 * 4.7683716e-07;
      iVar53 = movmskps(iVar18,auVar179);
      fVar169 = *(float *)(ray + k * 4 + 0x30);
      _local_288 = ZEXT416((uint)fVar169);
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      _local_308 = *pauVar8;
      fStack_2f4 = local_2f8;
      fStack_2f0 = local_2f8;
      fStack_2ec = local_2f8;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      local_2b8 = fVar246;
      fStack_2b4 = fVar249;
      fStack_2b0 = fVar257;
      local_2a8 = fVar274;
      fStack_2a4 = fVar276;
      fStack_2a0 = fVar319;
      local_298 = fVar236;
      fStack_294 = fVar239;
      fStack_290 = fVar244;
      fStack_274 = local_278;
      fStack_270 = local_278;
      fStack_26c = local_278;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      if (iVar53 != 0) {
        fVar157 = fVar113 * local_258 + local_228 * local_248 + fVar265 * fVar234 +
                  fVar293 * fVar211;
        fVar168 = fVar119 * local_258 + fStack_224 * local_248 + fVar279 * fVar234 +
                  fVar300 * fVar211;
        fVar170 = fVar208 * local_258 + fStack_220 * local_248 + fVar288 * fVar234 +
                  fVar301 * fVar211;
        fVar171 = fVar262 * local_258 + fStack_21c * local_248 + fVar290 * fVar234 +
                  fVar302 * fVar211;
        local_3e8 = auVar29._0_4_;
        fStack_3e4 = auVar29._4_4_;
        fStack_3e0 = auVar29._8_4_;
        local_308._0_4_ = auVar28._0_4_;
        local_308._4_4_ = auVar28._4_4_;
        fStack_300 = auVar28._8_4_;
        fVar76 = fVar153 * local_258 + (float)local_308._0_4_ * local_248 + fVar189 * fVar234 +
                 local_3e8 * fVar211;
        fVar114 = fVar156 * local_258 + (float)local_308._4_4_ * local_248 + fVar192 * fVar234 +
                  fStack_3e4 * fVar211;
        fVar116 = fVar167 * local_258 + fStack_300 * local_248 + fVar197 * fVar234 +
                  fStack_3e0 * fVar211;
        fVar118 = fVar172 * local_258 + fVar151 * local_248 + fVar206 * fVar234 + fVar266 * fVar211;
        fVar113 = *(float *)(catmullrom_basis0 + lVar22 + 0x1210);
        fVar119 = *(float *)(catmullrom_basis0 + lVar22 + 0x1214);
        fVar151 = *(float *)(catmullrom_basis0 + lVar22 + 0x1218);
        fVar153 = *(float *)(catmullrom_basis0 + lVar22 + 0x121c);
        fVar156 = *(float *)(catmullrom_basis0 + lVar22 + 0x1694);
        fVar167 = *(float *)(catmullrom_basis0 + lVar22 + 0x1698);
        fVar172 = *(float *)(catmullrom_basis0 + lVar22 + 0x169c);
        fVar189 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a0);
        fVar192 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b18);
        fVar197 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b1c);
        fVar206 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b20);
        fVar208 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b24);
        fVar262 = *(float *)(catmullrom_basis0 + lVar22 + 0x1f9c);
        fVar265 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa0);
        fVar266 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa4);
        fVar279 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa8);
        auVar26._4_4_ = local_268;
        auVar26._0_4_ = local_268;
        auVar26._8_4_ = local_268;
        auVar26._12_4_ = local_268;
        fVar280 = local_268 * fVar113 +
                  local_2f8 * fVar156 + fVar259 * fVar192 + local_2e8 * fVar262;
        fVar289 = local_268 * fVar119 +
                  local_2f8 * fVar167 + fVar259 * fVar197 + local_2e8 * fVar265;
        fVar291 = local_268 * fVar151 +
                  local_2f8 * fVar172 + fVar259 * fVar206 + local_2e8 * fVar266;
        fVar292 = local_268 * fVar153 +
                  local_2f8 * fVar189 + fVar259 * fVar208 + local_2e8 * fVar279;
        fVar336 = local_278 * fVar113 + local_348 * fVar156 + fVar267 * fVar192 + fVar115 * fVar262;
        fVar338 = local_278 * fVar119 + local_348 * fVar167 + fVar267 * fVar197 + fVar115 * fVar265;
        fVar340 = local_278 * fVar151 + local_348 * fVar172 + fVar267 * fVar206 + fVar115 * fVar266;
        fVar342 = local_278 * fVar153 + local_348 * fVar189 + fVar267 * fVar208 + fVar115 * fVar279;
        fVar288 = *(float *)(catmullrom_basis1 + lVar22 + 0x1210);
        fVar290 = *(float *)(catmullrom_basis1 + lVar22 + 0x1214);
        fVar293 = *(float *)(catmullrom_basis1 + lVar22 + 0x1218);
        fVar300 = *(float *)(catmullrom_basis1 + lVar22 + 0x121c);
        fVar301 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b18);
        fVar302 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b1c);
        fVar191 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b20);
        fVar194 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b24);
        fVar196 = *(float *)(catmullrom_basis1 + lVar22 + 0x1f9c);
        fVar275 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa0);
        fVar277 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa4);
        fVar278 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa8);
        fVar304 = *(float *)(catmullrom_basis1 + lVar22 + 0x1694);
        fVar314 = *(float *)(catmullrom_basis1 + lVar22 + 0x1698);
        fVar316 = *(float *)(catmullrom_basis1 + lVar22 + 0x169c);
        fVar318 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a0);
        fVar329 = local_268 * fVar288 +
                  local_2f8 * fVar304 + fVar259 * fVar301 + local_2e8 * fVar196;
        fVar332 = local_268 * fVar290 +
                  local_2f8 * fVar314 + fVar259 * fVar302 + local_2e8 * fVar275;
        fVar333 = local_268 * fVar293 +
                  local_2f8 * fVar316 + fVar259 * fVar191 + local_2e8 * fVar277;
        fVar334 = local_268 * fVar300 +
                  local_2f8 * fVar318 + fVar259 * fVar194 + local_2e8 * fVar278;
        fVar120 = local_278 * fVar288 + local_348 * fVar304 + fVar267 * fVar301 + fVar115 * fVar196;
        fVar152 = local_278 * fVar290 + local_348 * fVar314 + fVar267 * fVar302 + fVar115 * fVar275;
        fVar154 = local_278 * fVar293 + local_348 * fVar316 + fVar267 * fVar191 + fVar115 * fVar277;
        fVar155 = local_278 * fVar300 + local_348 * fVar318 + fVar267 * fVar194 + fVar115 * fVar278;
        auVar310._0_8_ = CONCAT44(fVar289,fVar280) & 0x7fffffff7fffffff;
        auVar310._8_4_ = ABS(fVar291);
        auVar310._12_4_ = ABS(fVar292);
        auVar264._0_8_ = CONCAT44(fVar338,fVar336) & 0x7fffffff7fffffff;
        auVar264._8_4_ = ABS(fVar340);
        auVar264._12_4_ = ABS(fVar342);
        auVar77 = maxps(auVar310,auVar264);
        auVar321._0_8_ =
             CONCAT44(fVar119 * fVar211 +
                      fVar167 * fVar234 + fVar197 * local_248 + fVar265 * local_258,
                      fVar113 * fVar211 +
                      fVar156 * fVar234 + fVar192 * local_248 + fVar262 * local_258) &
             0x7fffffff7fffffff;
        auVar321._8_4_ =
             ABS(fVar151 * fVar211 + fVar172 * fVar234 + fVar206 * local_248 + fVar266 * local_258);
        auVar321._12_4_ =
             ABS(fVar153 * fVar211 + fVar189 * fVar234 + fVar208 * local_248 + fVar279 * local_258);
        auVar77 = maxps(auVar77,auVar321);
        uVar71 = -(uint)(local_448 <= auVar77._0_4_);
        uVar68 = -(uint)(local_448 <= auVar77._4_4_);
        uVar70 = -(uint)(local_448 <= auVar77._8_4_);
        uVar72 = -(uint)(local_448 <= auVar77._12_4_);
        fVar156 = (float)((uint)fVar280 & uVar71 | ~uVar71 & (uint)fVar212);
        fVar167 = (float)((uint)fVar289 & uVar68 | ~uVar68 & (uint)fVar235);
        fVar172 = (float)((uint)fVar291 & uVar70 | ~uVar70 & (uint)fVar237);
        fVar189 = (float)((uint)fVar292 & uVar72 | ~uVar72 & (uint)fVar238);
        fVar262 = (float)(~uVar71 & (uint)fVar198 | (uint)fVar336 & uVar71);
        fVar265 = (float)(~uVar68 & (uint)fVar207 | (uint)fVar338 & uVar68);
        fVar266 = (float)(~uVar70 & (uint)fVar209 | (uint)fVar340 & uVar70);
        fVar279 = (float)(~uVar72 & (uint)fVar210 | (uint)fVar342 & uVar72);
        auVar322._0_8_ = CONCAT44(fVar332,fVar329) & 0x7fffffff7fffffff;
        auVar322._8_4_ = ABS(fVar333);
        auVar322._12_4_ = ABS(fVar334);
        auVar273._0_8_ = CONCAT44(fVar152,fVar120) & 0x7fffffff7fffffff;
        auVar273._8_4_ = ABS(fVar154);
        auVar273._12_4_ = ABS(fVar155);
        auVar77 = maxps(auVar322,auVar273);
        auVar242._0_8_ =
             CONCAT44(fVar290 * fVar211 +
                      fVar314 * fVar234 + fVar302 * local_248 + fVar275 * local_258,
                      fVar288 * fVar211 +
                      fVar304 * fVar234 + fVar301 * local_248 + fVar196 * local_258) &
             0x7fffffff7fffffff;
        auVar242._8_4_ =
             ABS(fVar293 * fVar211 + fVar316 * fVar234 + fVar191 * local_248 + fVar277 * local_258);
        auVar242._12_4_ =
             ABS(fVar300 * fVar211 + fVar318 * fVar234 + fVar194 * local_248 + fVar278 * local_258);
        auVar77 = maxps(auVar77,auVar242);
        uVar71 = -(uint)(local_448 <= auVar77._0_4_);
        uVar68 = -(uint)(local_448 <= auVar77._4_4_);
        uVar70 = -(uint)(local_448 <= auVar77._8_4_);
        uVar72 = -(uint)(local_448 <= auVar77._12_4_);
        fVar191 = (float)((uint)fVar329 & uVar71 | ~uVar71 & (uint)fVar212);
        fVar194 = (float)((uint)fVar332 & uVar68 | ~uVar68 & (uint)fVar235);
        fVar196 = (float)((uint)fVar333 & uVar70 | ~uVar70 & (uint)fVar237);
        fVar212 = (float)((uint)fVar334 & uVar72 | ~uVar72 & (uint)fVar238);
        fVar288 = (float)(~uVar71 & (uint)fVar198 | (uint)fVar120 & uVar71);
        fVar293 = (float)(~uVar68 & (uint)fVar207 | (uint)fVar152 & uVar68);
        fVar301 = (float)(~uVar70 & (uint)fVar209 | (uint)fVar154 & uVar70);
        fVar302 = (float)(~uVar72 & (uint)fVar210 | (uint)fVar155 & uVar72);
        auVar134._0_4_ = fVar262 * fVar262 + fVar156 * fVar156;
        auVar134._4_4_ = fVar265 * fVar265 + fVar167 * fVar167;
        auVar134._8_4_ = fVar266 * fVar266 + fVar172 * fVar172;
        auVar134._12_4_ = fVar279 * fVar279 + fVar189 * fVar189;
        auVar77 = rsqrtps(auVar26,auVar134);
        fVar113 = auVar77._0_4_;
        fVar119 = auVar77._4_4_;
        fVar151 = auVar77._8_4_;
        fVar153 = auVar77._12_4_;
        auVar200._0_4_ = fVar113 * fVar113 * auVar134._0_4_ * 0.5 * fVar113;
        auVar200._4_4_ = fVar119 * fVar119 * auVar134._4_4_ * 0.5 * fVar119;
        auVar200._8_4_ = fVar151 * fVar151 * auVar134._8_4_ * 0.5 * fVar151;
        auVar200._12_4_ = fVar153 * fVar153 * auVar134._12_4_ * 0.5 * fVar153;
        fVar198 = fVar113 * 1.5 - auVar200._0_4_;
        fVar207 = fVar119 * 1.5 - auVar200._4_4_;
        fVar209 = fVar151 * 1.5 - auVar200._8_4_;
        fVar210 = fVar153 * 1.5 - auVar200._12_4_;
        auVar135._0_4_ = fVar288 * fVar288 + fVar191 * fVar191;
        auVar135._4_4_ = fVar293 * fVar293 + fVar194 * fVar194;
        auVar135._8_4_ = fVar301 * fVar301 + fVar196 * fVar196;
        auVar135._12_4_ = fVar302 * fVar302 + fVar212 * fVar212;
        auVar77 = rsqrtps(auVar200,auVar135);
        fVar113 = auVar77._0_4_;
        fVar119 = auVar77._4_4_;
        fVar151 = auVar77._8_4_;
        fVar153 = auVar77._12_4_;
        fVar192 = fVar113 * 1.5 - fVar113 * fVar113 * auVar135._0_4_ * 0.5 * fVar113;
        fVar197 = fVar119 * 1.5 - fVar119 * fVar119 * auVar135._4_4_ * 0.5 * fVar119;
        fVar206 = fVar151 * 1.5 - fVar151 * fVar151 * auVar135._8_4_ * 0.5 * fVar151;
        fVar208 = fVar153 * 1.5 - fVar153 * fVar153 * auVar135._12_4_ * 0.5 * fVar153;
        fVar304 = fVar262 * fVar198 * fVar313;
        fVar314 = fVar265 * fVar207 * fVar317;
        fVar316 = fVar266 * fVar209 * fVar326;
        fVar318 = fVar279 * fVar210 * fVar328;
        fVar265 = -fVar156 * fVar198 * fVar313;
        fVar279 = -fVar167 * fVar207 * fVar317;
        fVar290 = -fVar172 * fVar209 * fVar326;
        fVar300 = -fVar189 * fVar210 * fVar328;
        fVar280 = fVar198 * 0.0 * fVar313;
        fVar289 = fVar207 * 0.0 * fVar317;
        fVar291 = fVar209 * 0.0 * fVar326;
        fVar292 = fVar210 * 0.0 * fVar328;
        fVar120 = fVar288 * fVar192 * fVar335;
        fVar152 = fVar293 * fVar197 * fVar337;
        fVar154 = fVar301 * fVar206 * fVar339;
        fVar155 = fVar302 * fVar208 * fVar341;
        fVar156 = fVar240 + fVar120;
        fVar167 = fVar245 + fVar152;
        fVar172 = fVar247 + fVar154;
        fVar189 = fVar248 + fVar155;
        fVar238 = -fVar191 * fVar192 * fVar335;
        fVar275 = -fVar194 * fVar197 * fVar337;
        fVar277 = -fVar196 * fVar206 * fVar339;
        fVar278 = -fVar212 * fVar208 * fVar341;
        fVar113 = fVar303 + fVar238;
        fVar119 = fVar315 + fVar275;
        fVar151 = fVar320 + fVar277;
        fVar153 = fVar327 + fVar278;
        fVar210 = fVar192 * 0.0 * fVar335;
        fVar212 = fVar197 * 0.0 * fVar337;
        fVar235 = fVar206 * 0.0 * fVar339;
        fVar237 = fVar208 * 0.0 * fVar341;
        fVar192 = fVar250 - fVar304;
        fVar197 = fVar258 - fVar314;
        fVar206 = fVar260 - fVar316;
        fVar208 = fVar261 - fVar318;
        fVar196 = fVar157 + fVar210;
        fVar198 = fVar168 + fVar212;
        fVar207 = fVar170 + fVar235;
        fVar209 = fVar171 + fVar237;
        fVar262 = fVar173 - fVar265;
        fVar266 = fVar190 - fVar279;
        fVar288 = fVar193 - fVar290;
        fVar293 = fVar195 - fVar300;
        fVar301 = fVar76 - fVar280;
        fVar302 = fVar114 - fVar289;
        fVar191 = fVar116 - fVar291;
        fVar194 = fVar118 - fVar292;
        uVar71 = -(uint)(0.0 < (fVar262 * (fVar196 - fVar301) - fVar301 * (fVar113 - fVar262)) * 0.0
                               + (fVar301 * (fVar156 - fVar192) - (fVar196 - fVar301) * fVar192) *
                                 0.0 + ((fVar113 - fVar262) * fVar192 -
                                       (fVar156 - fVar192) * fVar262));
        uVar68 = -(uint)(0.0 < (fVar266 * (fVar198 - fVar302) - fVar302 * (fVar119 - fVar266)) * 0.0
                               + (fVar302 * (fVar167 - fVar197) - (fVar198 - fVar302) * fVar197) *
                                 0.0 + ((fVar119 - fVar266) * fVar197 -
                                       (fVar167 - fVar197) * fVar266));
        uVar70 = -(uint)(0.0 < (fVar288 * (fVar207 - fVar191) - fVar191 * (fVar151 - fVar288)) * 0.0
                               + (fVar191 * (fVar172 - fVar206) - (fVar207 - fVar191) * fVar206) *
                                 0.0 + ((fVar151 - fVar288) * fVar206 -
                                       (fVar172 - fVar206) * fVar288));
        uVar72 = -(uint)(0.0 < (fVar293 * (fVar209 - fVar194) - fVar194 * (fVar153 - fVar293)) * 0.0
                               + (fVar194 * (fVar189 - fVar208) - (fVar209 - fVar194) * fVar208) *
                                 0.0 + ((fVar153 - fVar293) * fVar208 -
                                       (fVar189 - fVar208) * fVar293));
        fVar304 = (float)((uint)(fVar240 - fVar120) & uVar71 | ~uVar71 & (uint)(fVar250 + fVar304));
        fVar258 = (float)((uint)(fVar245 - fVar152) & uVar68 | ~uVar68 & (uint)(fVar258 + fVar314));
        fVar260 = (float)((uint)(fVar247 - fVar154) & uVar70 | ~uVar70 & (uint)(fVar260 + fVar316));
        fVar261 = (float)((uint)(fVar248 - fVar155) & uVar72 | ~uVar72 & (uint)(fVar261 + fVar318));
        fVar238 = (float)((uint)(fVar303 - fVar238) & uVar71 | ~uVar71 & (uint)(fVar173 + fVar265));
        fVar240 = (float)((uint)(fVar315 - fVar275) & uVar68 | ~uVar68 & (uint)(fVar190 + fVar279));
        fVar245 = (float)((uint)(fVar320 - fVar277) & uVar70 | ~uVar70 & (uint)(fVar193 + fVar290));
        fVar247 = (float)((uint)(fVar327 - fVar278) & uVar72 | ~uVar72 & (uint)(fVar195 + fVar300));
        fVar193 = (float)((uint)(fVar157 - fVar210) & uVar71 | ~uVar71 & (uint)(fVar76 + fVar280));
        fVar195 = (float)((uint)(fVar168 - fVar212) & uVar68 | ~uVar68 & (uint)(fVar114 + fVar289));
        fVar210 = (float)((uint)(fVar170 - fVar235) & uVar70 | ~uVar70 & (uint)(fVar116 + fVar291));
        fVar212 = (float)((uint)(fVar171 - fVar237) & uVar72 | ~uVar72 & (uint)(fVar118 + fVar292));
        fVar303 = (float)((uint)fVar192 & uVar71 | ~uVar71 & (uint)fVar156);
        fVar315 = (float)((uint)fVar197 & uVar68 | ~uVar68 & (uint)fVar167);
        fVar320 = (float)((uint)fVar206 & uVar70 | ~uVar70 & (uint)fVar172);
        fVar327 = (float)((uint)fVar208 & uVar72 | ~uVar72 & (uint)fVar189);
        fVar265 = (float)((uint)fVar262 & uVar71 | ~uVar71 & (uint)fVar113);
        fVar279 = (float)((uint)fVar266 & uVar68 | ~uVar68 & (uint)fVar119);
        fVar290 = (float)((uint)fVar288 & uVar70 | ~uVar70 & (uint)fVar151);
        fVar300 = (float)((uint)fVar293 & uVar72 | ~uVar72 & (uint)fVar153);
        fVar235 = (float)((uint)fVar301 & uVar71 | ~uVar71 & (uint)fVar196);
        fVar237 = (float)((uint)fVar302 & uVar68 | ~uVar68 & (uint)fVar198);
        fVar248 = (float)((uint)fVar191 & uVar70 | ~uVar70 & (uint)fVar207);
        fVar250 = (float)((uint)fVar194 & uVar72 | ~uVar72 & (uint)fVar209);
        fVar192 = (float)((uint)fVar156 & uVar71 | ~uVar71 & (uint)fVar192) - fVar304;
        fVar197 = (float)((uint)fVar167 & uVar68 | ~uVar68 & (uint)fVar197) - fVar258;
        fVar206 = (float)((uint)fVar172 & uVar70 | ~uVar70 & (uint)fVar206) - fVar260;
        fVar208 = (float)((uint)fVar189 & uVar72 | ~uVar72 & (uint)fVar208) - fVar261;
        fVar113 = (float)((uint)fVar113 & uVar71 | ~uVar71 & (uint)fVar262) - fVar238;
        fVar119 = (float)((uint)fVar119 & uVar68 | ~uVar68 & (uint)fVar266) - fVar240;
        fVar151 = (float)((uint)fVar151 & uVar70 | ~uVar70 & (uint)fVar288) - fVar245;
        fVar153 = (float)((uint)fVar153 & uVar72 | ~uVar72 & (uint)fVar293) - fVar247;
        fVar301 = (float)((uint)fVar196 & uVar71 | ~uVar71 & (uint)fVar301) - fVar193;
        fVar302 = (float)((uint)fVar198 & uVar68 | ~uVar68 & (uint)fVar302) - fVar195;
        fVar173 = (float)((uint)fVar207 & uVar70 | ~uVar70 & (uint)fVar191) - fVar210;
        fVar190 = (float)((uint)fVar209 & uVar72 | ~uVar72 & (uint)fVar194) - fVar212;
        fVar207 = fVar304 - fVar303;
        fVar209 = fVar258 - fVar315;
        fVar275 = fVar260 - fVar320;
        fVar277 = fVar261 - fVar327;
        fVar262 = fVar238 - fVar265;
        fVar266 = fVar240 - fVar279;
        fVar288 = fVar245 - fVar290;
        fVar293 = fVar247 - fVar300;
        fVar156 = fVar193 - fVar235;
        fVar167 = fVar195 - fVar237;
        fVar172 = fVar210 - fVar248;
        fVar189 = fVar212 - fVar250;
        fVar191 = (fVar238 * fVar301 - fVar193 * fVar113) * 0.0 +
                  (fVar193 * fVar192 - fVar304 * fVar301) * 0.0 +
                  (fVar304 * fVar113 - fVar238 * fVar192);
        fVar194 = (fVar240 * fVar302 - fVar195 * fVar119) * 0.0 +
                  (fVar195 * fVar197 - fVar258 * fVar302) * 0.0 +
                  (fVar258 * fVar119 - fVar240 * fVar197);
        auVar180._4_4_ = fVar194;
        auVar180._0_4_ = fVar191;
        fVar196 = (fVar245 * fVar173 - fVar210 * fVar151) * 0.0 +
                  (fVar210 * fVar206 - fVar260 * fVar173) * 0.0 +
                  (fVar260 * fVar151 - fVar245 * fVar206);
        fVar198 = (fVar247 * fVar190 - fVar212 * fVar153) * 0.0 +
                  (fVar212 * fVar208 - fVar261 * fVar190) * 0.0 +
                  (fVar261 * fVar153 - fVar247 * fVar208);
        auVar330._0_4_ =
             (fVar265 * fVar156 - fVar235 * fVar262) * 0.0 +
             (fVar235 * fVar207 - fVar303 * fVar156) * 0.0 + (fVar303 * fVar262 - fVar265 * fVar207)
        ;
        auVar330._4_4_ =
             (fVar279 * fVar167 - fVar237 * fVar266) * 0.0 +
             (fVar237 * fVar209 - fVar315 * fVar167) * 0.0 + (fVar315 * fVar266 - fVar279 * fVar209)
        ;
        auVar330._8_4_ =
             (fVar290 * fVar172 - fVar248 * fVar288) * 0.0 +
             (fVar248 * fVar275 - fVar320 * fVar172) * 0.0 + (fVar320 * fVar288 - fVar290 * fVar275)
        ;
        auVar330._12_4_ =
             (fVar300 * fVar189 - fVar250 * fVar293) * 0.0 +
             (fVar250 * fVar277 - fVar327 * fVar189) * 0.0 + (fVar327 * fVar293 - fVar300 * fVar277)
        ;
        auVar180._8_4_ = fVar196;
        auVar180._12_4_ = fVar198;
        auVar77 = maxps(auVar180,auVar330);
        bVar51 = auVar77._0_4_ <= 0.0 && bVar51;
        auVar181._0_4_ = -(uint)bVar51;
        bVar52 = auVar77._4_4_ <= 0.0 && bVar52;
        auVar181._4_4_ = -(uint)bVar52;
        bVar50 = auVar77._8_4_ <= 0.0 && bVar50;
        auVar181._8_4_ = -(uint)bVar50;
        bVar49 = auVar77._12_4_ <= 0.0 && bVar49;
        auVar181._12_4_ = -(uint)bVar49;
        iVar53 = movmskps(iVar53,auVar181);
        if (iVar53 == 0) {
LAB_00c2d8a7:
          auVar182._8_8_ = uStack_360;
          auVar182._0_8_ = local_368;
        }
        else {
          auVar201._0_4_ = fVar156 * fVar113;
          auVar201._4_4_ = fVar167 * fVar119;
          auVar201._8_4_ = fVar172 * fVar151;
          auVar201._12_4_ = fVar189 * fVar153;
          fVar265 = fVar262 * fVar301 - auVar201._0_4_;
          fVar279 = fVar266 * fVar302 - auVar201._4_4_;
          fVar290 = fVar288 * fVar173 - auVar201._8_4_;
          fVar300 = fVar293 * fVar190 - auVar201._12_4_;
          fVar156 = fVar156 * fVar192 - fVar301 * fVar207;
          fVar167 = fVar167 * fVar197 - fVar302 * fVar209;
          fVar172 = fVar172 * fVar206 - fVar173 * fVar275;
          fVar189 = fVar189 * fVar208 - fVar190 * fVar277;
          fVar113 = fVar207 * fVar113 - fVar262 * fVar192;
          fVar197 = fVar209 * fVar119 - fVar266 * fVar197;
          fVar206 = fVar275 * fVar151 - fVar288 * fVar206;
          fVar208 = fVar277 * fVar153 - fVar293 * fVar208;
          auVar230._0_4_ = fVar265 * 0.0 + fVar156 * 0.0 + fVar113;
          auVar230._4_4_ = fVar279 * 0.0 + fVar167 * 0.0 + fVar197;
          auVar230._8_4_ = fVar290 * 0.0 + fVar172 * 0.0 + fVar206;
          auVar230._12_4_ = fVar300 * 0.0 + fVar189 * 0.0 + fVar208;
          auVar77 = rcpps(auVar201,auVar230);
          fVar119 = auVar77._0_4_;
          fVar151 = auVar77._4_4_;
          fVar153 = auVar77._8_4_;
          fVar192 = auVar77._12_4_;
          fVar119 = (1.0 - auVar230._0_4_ * fVar119) * fVar119 + fVar119;
          fVar151 = (1.0 - auVar230._4_4_ * fVar151) * fVar151 + fVar151;
          fVar153 = (1.0 - auVar230._8_4_ * fVar153) * fVar153 + fVar153;
          fVar192 = (1.0 - auVar230._12_4_ * fVar192) * fVar192 + fVar192;
          fVar156 = (fVar193 * fVar113 + fVar238 * fVar156 + fVar304 * fVar265) * fVar119;
          fVar167 = (fVar195 * fVar197 + fVar240 * fVar167 + fVar258 * fVar279) * fVar151;
          fVar172 = (fVar210 * fVar206 + fVar245 * fVar172 + fVar260 * fVar290) * fVar153;
          fVar189 = (fVar212 * fVar208 + fVar247 * fVar189 + fVar261 * fVar300) * fVar192;
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          bVar51 = (fVar156 <= fVar113 && fVar169 <= fVar156) && bVar51;
          auVar98._0_4_ = -(uint)bVar51;
          bVar52 = (fVar167 <= fVar113 && fVar169 <= fVar167) && bVar52;
          auVar98._4_4_ = -(uint)bVar52;
          bVar50 = (fVar172 <= fVar113 && fVar169 <= fVar172) && bVar50;
          auVar98._8_4_ = -(uint)bVar50;
          bVar49 = (fVar189 <= fVar113 && fVar169 <= fVar189) && bVar49;
          auVar98._12_4_ = -(uint)bVar49;
          iVar53 = movmskps(iVar53,auVar98);
          if (iVar53 == 0) goto LAB_00c2d8a7;
          auVar99._0_8_ =
               CONCAT44(-(uint)(auVar230._4_4_ != 0.0 && bVar52),
                        -(uint)(auVar230._0_4_ != 0.0 && bVar51));
          auVar99._8_4_ = -(uint)(auVar230._8_4_ != 0.0 && bVar50);
          auVar99._12_4_ = -(uint)(auVar230._12_4_ != 0.0 && bVar49);
          iVar53 = movmskps(iVar53,auVar99);
          auVar182._8_8_ = uStack_360;
          auVar182._0_8_ = local_368;
          if (iVar53 != 0) {
            fVar191 = fVar191 * fVar119;
            fVar194 = fVar194 * fVar151;
            fVar196 = fVar196 * fVar153;
            fVar198 = fVar198 * fVar192;
            local_3a8 = (float)((uint)(1.0 - fVar191) & uVar71 | ~uVar71 & (uint)fVar191);
            fStack_3a4 = (float)((uint)(1.0 - fVar194) & uVar68 | ~uVar68 & (uint)fVar194);
            fStack_3a0 = (float)((uint)(1.0 - fVar196) & uVar70 | ~uVar70 & (uint)fVar196);
            fStack_39c = (float)((uint)(1.0 - fVar198) & uVar72 | ~uVar72 & (uint)fVar198);
            local_238 = (float)(~uVar71 & (uint)(auVar330._0_4_ * fVar119) |
                               (uint)(1.0 - auVar330._0_4_ * fVar119) & uVar71);
            fStack_234 = (float)(~uVar68 & (uint)(auVar330._4_4_ * fVar151) |
                                (uint)(1.0 - auVar330._4_4_ * fVar151) & uVar68);
            fStack_230 = (float)(~uVar70 & (uint)(auVar330._8_4_ * fVar153) |
                                (uint)(1.0 - auVar330._8_4_ * fVar153) & uVar70);
            fStack_22c = (float)(~uVar72 & (uint)(auVar330._12_4_ * fVar192) |
                                (uint)(1.0 - auVar330._12_4_ * fVar192) & uVar72);
            auVar182._8_4_ = auVar99._8_4_;
            auVar182._0_8_ = auVar99._0_8_;
            auVar182._12_4_ = auVar99._12_4_;
            local_3b8 = fVar156;
            fStack_3b4 = fVar167;
            fStack_3b0 = fVar172;
            fStack_3ac = fVar189;
          }
        }
        iVar53 = movmskps(iVar53,auVar182);
        _local_308 = auVar179;
        if (iVar53 != 0) {
          fVar313 = (fVar335 - fVar313) * local_3a8 + fVar313;
          fVar317 = (fVar337 - fVar317) * fStack_3a4 + fVar317;
          fVar326 = (fVar339 - fVar326) * fStack_3a0 + fVar326;
          fVar328 = (fVar341 - fVar328) * fStack_39c + fVar328;
          fVar169 = *(float *)((long)local_370->ray_space + k * 4 + -0x10);
          auVar100._0_4_ = -(uint)(fVar169 * (fVar313 + fVar313) < local_3b8) & auVar182._0_4_;
          auVar100._4_4_ = -(uint)(fVar169 * (fVar317 + fVar317) < fStack_3b4) & auVar182._4_4_;
          auVar100._8_4_ = -(uint)(fVar169 * (fVar326 + fVar326) < fStack_3b0) & auVar182._8_4_;
          auVar100._12_4_ = -(uint)(fVar169 * (fVar328 + fVar328) < fStack_3ac) & auVar182._12_4_;
          iVar53 = movmskps((int)local_370,auVar100);
          if (iVar53 != 0) {
            local_238 = local_238 + local_238 + -1.0;
            fStack_234 = fStack_234 + fStack_234 + -1.0;
            fStack_230 = fStack_230 + fStack_230 + -1.0;
            fStack_22c = fStack_22c + fStack_22c + -1.0;
            local_1d8 = 0;
            local_1c8 = CONCAT44(fStack_354,local_358);
            uStack_1c0 = CONCAT44(fStack_34c,fStack_350);
            local_1b8 = CONCAT44(fVar276,fVar274);
            uStack_1b0 = CONCAT44(fStack_29c,fVar319);
            local_1a8 = CONCAT44(fVar249,fVar246);
            uStack_1a0 = CONCAT44(fStack_2ac,fVar257);
            local_198 = CONCAT44(fVar239,fVar236);
            uStack_190 = CONCAT44(fStack_28c,fVar244);
            local_208 = local_3a8;
            fStack_204 = fStack_3a4;
            fStack_200 = fStack_3a0;
            fStack_1fc = fStack_39c;
            local_1f8 = local_238;
            fStack_1f4 = fStack_234;
            fStack_1f0 = fStack_230;
            fStack_1ec = fStack_22c;
            local_1e8 = local_3b8;
            fStack_1e4 = fStack_3b4;
            fStack_1e0 = fStack_3b0;
            fStack_1dc = fStack_3ac;
            local_1d4 = iVar18;
            local_188 = auVar100;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar75 = 1.0 / fVar75;
              local_178[0] = fVar75 * (local_3a8 + 0.0);
              local_178[1] = fVar75 * (fStack_3a4 + 1.0);
              local_178[2] = fVar75 * (fStack_3a0 + 2.0);
              local_178[3] = fVar75 * (fStack_39c + 3.0);
              local_168 = CONCAT44(fStack_234,local_238);
              uStack_160 = CONCAT44(fStack_22c,fStack_230);
              local_158[0] = local_3b8;
              local_158[1] = fStack_3b4;
              local_158[2] = fStack_3b0;
              local_158[3] = fStack_3ac;
              auVar136._0_4_ = auVar100._0_4_ & (uint)local_3b8;
              auVar136._4_4_ = auVar100._4_4_ & (uint)fStack_3b4;
              auVar136._8_4_ = auVar100._8_4_ & (uint)fStack_3b0;
              auVar136._12_4_ = auVar100._12_4_ & (uint)fStack_3ac;
              auVar160._0_8_ = CONCAT44(~auVar100._4_4_,~auVar100._0_4_) & 0x7f8000007f800000;
              auVar160._8_4_ = ~auVar100._8_4_ & 0x7f800000;
              auVar160._12_4_ = ~auVar100._12_4_ & 0x7f800000;
              auVar160 = auVar160 | auVar136;
              auVar183._4_4_ = auVar160._0_4_;
              auVar183._0_4_ = auVar160._4_4_;
              auVar183._8_4_ = auVar160._12_4_;
              auVar183._12_4_ = auVar160._8_4_;
              auVar77 = minps(auVar183,auVar160);
              auVar137._0_8_ = auVar77._8_8_;
              auVar137._8_4_ = auVar77._0_4_;
              auVar137._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar137,auVar77);
              auVar138._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar160._4_4_) & auVar100._4_4_,
                            -(uint)(auVar77._0_4_ == auVar160._0_4_) & auVar100._0_4_);
              auVar138._8_4_ = -(uint)(auVar77._8_4_ == auVar160._8_4_) & auVar100._8_4_;
              auVar138._12_4_ = -(uint)(auVar77._12_4_ == auVar160._12_4_) & auVar100._12_4_;
              iVar53 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar138);
              auVar101 = auVar100;
              if (iVar53 != 0) {
                auVar101._8_4_ = auVar138._8_4_;
                auVar101._0_8_ = auVar138._0_8_;
                auVar101._12_4_ = auVar138._12_4_;
              }
              uVar71 = movmskps(iVar53,auVar101);
              uVar63 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                }
              }
              local_398 = auVar100;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar169 = local_178[uVar63];
                fVar75 = 1.0 - fVar169;
                fVar119 = fVar169 * 3.0;
                fVar151 = ((fVar119 + 2.0) * (fVar75 + fVar75) + fVar75 * -3.0 * fVar75) * 0.5;
                fVar113 = (fVar75 * -2.0 * fVar169 + fVar169 * fVar169) * 0.5;
                fVar119 = (fVar169 * fVar119 + (fVar119 + -5.0) * (fVar169 + fVar169)) * 0.5;
                uVar59 = *(undefined4 *)((long)&local_168 + uVar63 * 4);
                fVar75 = (fVar169 * (fVar75 + fVar75) - fVar75 * fVar75) * 0.5;
                *(float *)(ray + k * 4 + 0x80) = local_158[uVar63];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar75 * local_358 + fVar119 * fVar274 + fVar151 * fVar246 + fVar113 * fVar236;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar75 * fStack_354 + fVar119 * fVar276 + fVar151 * fVar249 + fVar113 * fVar239
                ;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar75 * fStack_350 + fVar119 * fVar319 + fVar151 * fVar257 + fVar113 * fVar244
                ;
                *(float *)(ray + k * 4 + 0xf0) = fVar169;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar59;
                *(uint *)(ray + k * 4 + 0x110) = uVar69;
                *(uint *)(ray + k * 4 + 0x120) = uVar67;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar60 = (RTCIntersectArguments *)context;
              }
              else {
                local_4c8 = CONCAT44(uVar67,uVar67);
                uStack_4c0 = CONCAT44(uVar67,uVar67);
                local_458 = CONCAT44(uVar69,uVar69);
                uStack_450._0_4_ = uVar69;
                uStack_450._4_4_ = uVar69;
                uVar117 = *local_2d0;
                uVar25 = local_2d0[1];
                do {
                  local_d8 = local_178[uVar63];
                  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_c8 = *(undefined4 *)((long)&local_168 + uVar63 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_158[uVar63];
                  fVar151 = 1.0 - local_d8;
                  fVar169 = local_d8 * 3.0;
                  fVar119 = ((fVar169 + 2.0) * (fVar151 + fVar151) + fVar151 * -3.0 * fVar151) * 0.5
                  ;
                  fVar75 = (local_d8 * local_d8 + fVar151 * -2.0 * local_d8) * 0.5;
                  fVar113 = (local_d8 * fVar169 + (fVar169 + -5.0) * (local_d8 + local_d8)) * 0.5;
                  local_338.context = context->user;
                  fVar169 = (local_d8 * (fVar151 + fVar151) - fVar151 * fVar151) * 0.5;
                  local_108._0_4_ =
                       fVar169 * local_358 +
                       fVar113 * fVar274 + fVar119 * fVar246 + fVar75 * fVar236;
                  local_f8 = fVar169 * fStack_354 +
                             fVar113 * fVar276 + fVar119 * fVar249 + fVar75 * fVar239;
                  local_e8 = fVar169 * fStack_350 +
                             fVar113 * fVar319 + fVar119 * fVar257 + fVar75 * fVar244;
                  local_108._4_4_ = local_108._0_4_;
                  local_108._8_4_ = local_108._0_4_;
                  fStack_fc = (float)local_108._0_4_;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = local_458;
                  uStack_b0 = uStack_450;
                  local_a8 = local_4c8;
                  uStack_a0 = uStack_4c0;
                  local_98 = (local_338.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (local_338.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  local_338.valid = (int *)&local_388;
                  pRVar60 = (RTCIntersectArguments *)pGVar19->userPtr;
                  local_338.hit = (RTCHitN *)local_108;
                  local_338.N = 4;
                  p_Var55 = pGVar19->intersectionFilterN;
                  local_388 = uVar117;
                  uStack_380 = uVar25;
                  local_338.geometryUserPtr = pRVar60;
                  local_338.ray = (RTCRayN *)ray;
                  if (p_Var55 != (RTCFilterFunctionN)0x0) {
                    p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_338);
                  }
                  auVar108._0_4_ = -(uint)((int)local_388 == 0);
                  auVar108._4_4_ = -(uint)(local_388._4_4_ == 0);
                  auVar108._8_4_ = -(uint)((int)uStack_380 == 0);
                  auVar108._12_4_ = -(uint)(uStack_380._4_4_ == 0);
                  uVar71 = movmskps((int)p_Var55,auVar108);
                  pRVar56 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                  if ((uVar71 ^ 0xf) == 0) {
                    auVar108 = auVar108 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar60 = context->args;
                    pRVar57 = (RTCIntersectArguments *)pRVar60->filter;
                    if ((pRVar57 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                        (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar57 = (RTCIntersectArguments *)(*(code *)pRVar57)(&local_338);
                    }
                    auVar147._0_4_ = -(uint)((int)local_388 == 0);
                    auVar147._4_4_ = -(uint)(local_388._4_4_ == 0);
                    auVar147._8_4_ = -(uint)((int)uStack_380 == 0);
                    auVar147._12_4_ = -(uint)(uStack_380._4_4_ == 0);
                    auVar108 = auVar147 ^ _DAT_01febe20;
                    uVar71 = movmskps((int)pRVar57,auVar147);
                    pRVar56 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                    if ((uVar71 ^ 0xf) != 0) {
                      RVar24 = *(RTCFeatureFlags *)((long)local_338.hit + 4);
                      uVar71 = *(uint *)((long)local_338.hit + 8);
                      uVar68 = *(uint *)((long)((long)local_338.hit + 8) + 4);
                      *(uint *)(local_338.ray + 0xc0) =
                           ~auVar147._0_4_ & *(uint *)&(local_338.hit)->field_0x0 |
                           *(uint *)(local_338.ray + 0xc0) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xc4) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xc4) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 200) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 200) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0xcc) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0xcc) & auVar147._12_4_;
                      RVar24 = *(RTCFeatureFlags *)((long)((long)local_338.hit + 0x10) + 4);
                      uVar71 = *(uint *)((long)local_338.hit + 0x18);
                      uVar68 = *(uint *)((long)((long)local_338.hit + 0x18) + 4);
                      *(uint *)(local_338.ray + 0xd0) =
                           ~auVar147._0_4_ & *(uint *)((long)local_338.hit + 0x10) |
                           *(uint *)(local_338.ray + 0xd0) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xd4) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xd4) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0xd8) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0xd8) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0xdc) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0xdc) & auVar147._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0xe0) =
                           ~auVar147._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->flags |
                           *(uint *)(local_338.ray + 0xe0) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xe4) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xe4) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0xe8) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0xe8) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0xec) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0xec) & auVar147._12_4_;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x20))->intersect + 4);
                      *(uint *)(local_338.ray + 0xf0) =
                           ~auVar147._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->filter
                           | *(uint *)(local_338.ray + 0xf0) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xf4) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xf4) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0xf8) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0xf8) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0xfc) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0xfc) & auVar147._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x100) =
                           ~auVar147._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->flags |
                           *(uint *)(local_338.ray + 0x100) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x104) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x104) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0x108) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0x108) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0x10c) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0x10c) & auVar147._12_4_;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x40))->intersect + 4);
                      *(uint *)(local_338.ray + 0x110) =
                           *(uint *)(local_338.ray + 0x110) & auVar147._0_4_ |
                           ~auVar147._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_338.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_338.ray + 0x114) & auVar147._4_4_ |
                           ~auVar147._4_4_ & RVar24;
                      *(uint *)(local_338.ray + 0x118) =
                           *(uint *)(local_338.ray + 0x118) & auVar147._8_4_ |
                           ~auVar147._8_4_ & uVar71;
                      *(uint *)(local_338.ray + 0x11c) =
                           *(uint *)(local_338.ray + 0x11c) & auVar147._12_4_ |
                           ~auVar147._12_4_ & uVar68;
                      RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x120) =
                           *(uint *)(local_338.ray + 0x120) & auVar147._0_4_ |
                           ~auVar147._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_338.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_338.ray + 0x124) & auVar147._4_4_ |
                           ~auVar147._4_4_ & RVar24;
                      *(uint *)(local_338.ray + 0x128) =
                           *(uint *)(local_338.ray + 0x128) & auVar147._8_4_ |
                           ~auVar147._8_4_ & uVar71;
                      *(uint *)(local_338.ray + 300) =
                           *(uint *)(local_338.ray + 300) & auVar147._12_4_ |
                           ~auVar147._12_4_ & uVar68;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x60))->intersect + 4);
                      *(uint *)(local_338.ray + 0x130) =
                           ~auVar147._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->filter
                           | *(uint *)(local_338.ray + 0x130) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x134) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x134) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0x138) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0x138) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0x13c) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0x13c) & auVar147._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x80))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x80))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x140) =
                           ~auVar147._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->flags |
                           *(uint *)(local_338.ray + 0x140) & auVar147._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x144) =
                           ~auVar147._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x144) & auVar147._4_4_;
                      *(uint *)(local_338.ray + 0x148) =
                           ~auVar147._8_4_ & uVar71 |
                           *(uint *)(local_338.ray + 0x148) & auVar147._8_4_;
                      *(uint *)(local_338.ray + 0x14c) =
                           ~auVar147._12_4_ & uVar68 |
                           *(uint *)(local_338.ray + 0x14c) & auVar147._12_4_;
                      pRVar56 = (RayHitK<4> *)local_338.ray;
                      pRVar60 = (RTCIntersectArguments *)local_338.hit;
                    }
                  }
                  auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                  auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                  auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                  auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                  iVar53 = movmskps((int)pRVar56,auVar109);
                  if (iVar53 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar59;
                  }
                  *(undefined4 *)(local_398 + uVar63 * 4) = 0;
                  fVar169 = *(float *)(ray + k * 4 + 0x80);
                  local_398._0_4_ = -(uint)(local_3b8 <= fVar169) & local_398._0_4_;
                  local_398._4_4_ = -(uint)(fStack_3b4 <= fVar169) & local_398._4_4_;
                  local_398._8_4_ = -(uint)(fStack_3b0 <= fVar169) & local_398._8_4_;
                  local_398._12_4_ = -(uint)(fStack_3ac <= fVar169) & local_398._12_4_;
                  iVar53 = movmskps(iVar53,local_398);
                  if (iVar53 != 0) {
                    auVar148._0_4_ = local_398._0_4_ & (uint)local_3b8;
                    auVar148._4_4_ = local_398._4_4_ & (uint)fStack_3b4;
                    auVar148._8_4_ = local_398._8_4_ & (uint)fStack_3b0;
                    auVar148._12_4_ = local_398._12_4_ & (uint)fStack_3ac;
                    auVar166._0_8_ =
                         CONCAT44(~local_398._4_4_,~local_398._0_4_) & 0x7f8000007f800000;
                    auVar166._8_4_ = ~local_398._8_4_ & 0x7f800000;
                    auVar166._12_4_ = ~local_398._12_4_ & 0x7f800000;
                    auVar166 = auVar166 | auVar148;
                    auVar188._4_4_ = auVar166._0_4_;
                    auVar188._0_4_ = auVar166._4_4_;
                    auVar188._8_4_ = auVar166._12_4_;
                    auVar188._12_4_ = auVar166._8_4_;
                    auVar77 = minps(auVar188,auVar166);
                    auVar149._0_8_ = auVar77._8_8_;
                    auVar149._8_4_ = auVar77._0_4_;
                    auVar149._12_4_ = auVar77._4_4_;
                    auVar77 = minps(auVar149,auVar77);
                    auVar150._0_8_ =
                         CONCAT44(-(uint)(auVar77._4_4_ == auVar166._4_4_) & local_398._4_4_,
                                  -(uint)(auVar77._0_4_ == auVar166._0_4_) & local_398._0_4_);
                    auVar150._8_4_ = -(uint)(auVar77._8_4_ == auVar166._8_4_) & local_398._8_4_;
                    auVar150._12_4_ = -(uint)(auVar77._12_4_ == auVar166._12_4_) & local_398._12_4_;
                    iVar58 = movmskps((int)pRVar60,auVar150);
                    auVar110 = local_398;
                    if (iVar58 != 0) {
                      auVar110._8_4_ = auVar150._8_4_;
                      auVar110._0_8_ = auVar150._0_8_;
                      auVar110._12_4_ = auVar150._12_4_;
                    }
                    uVar59 = movmskps(iVar58,auVar110);
                    pRVar60 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar60 >> 0x20),uVar59);
                    uVar63 = 0;
                    if (pRVar60 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar60 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                      }
                    }
                  }
                } while ((char)iVar53 != '\0');
              }
            }
          }
          uVar59 = SUB84(pRVar60,0);
        }
      }
      if (4 < iVar18) {
        local_58 = iVar18;
        iStack_54 = iVar18;
        iStack_50 = iVar18;
        iStack_4c = iVar18;
        local_288._4_4_ = local_288._0_4_;
        fStack_280 = (float)local_288._0_4_;
        fStack_27c = (float)local_288._0_4_;
        local_2c8._4_4_ = 1.0 / (float)local_2c8._0_4_;
        local_2c8._0_4_ = local_2c8._4_4_;
        fStack_2c0 = (float)local_2c8._4_4_;
        fStack_2bc = (float)local_2c8._4_4_;
        local_68 = uVar67;
        uStack_64 = uVar67;
        uStack_60 = uVar67;
        uStack_5c = uVar67;
        local_78 = uVar69;
        uStack_74 = uVar69;
        uStack_70 = uVar69;
        uStack_6c = uVar69;
        lVar64 = 4;
        do {
          fVar320 = fStack_290;
          fVar317 = fStack_294;
          fVar315 = local_298;
          fVar313 = fStack_2a0;
          fVar303 = fStack_2a4;
          fVar302 = local_2a8;
          fVar301 = fStack_2b0;
          fVar300 = fStack_2b4;
          fVar293 = local_2b8;
          uVar68 = (uint)lVar64;
          pRVar60 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar22);
          pfVar1 = (float *)((long)&pRVar60->flags + lVar64 * 4);
          fVar169 = *pfVar1;
          fVar75 = pfVar1[1];
          fVar113 = pfVar1[2];
          fVar119 = pfVar1[3];
          pauVar8 = (undefined1 (*) [16])(lVar22 + 0x22307f0 + lVar64 * 4);
          fVar151 = *(float *)*pauVar8;
          fVar153 = *(float *)(*pauVar8 + 4);
          fVar156 = *(float *)(*pauVar8 + 8);
          auVar28 = *(undefined1 (*) [12])*pauVar8;
          fVar167 = *(float *)(*pauVar8 + 0xc);
          _local_308 = *pauVar8;
          pfVar1 = (float *)(lVar22 + 0x2230c74 + lVar64 * 4);
          fVar172 = *pfVar1;
          fVar189 = pfVar1[1];
          fVar192 = pfVar1[2];
          fVar197 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x22310f8 + lVar64 * 4);
          fVar206 = *pfVar1;
          fVar208 = pfVar1[1];
          fVar236 = pfVar1[2];
          fVar239 = pfVar1[3];
          fVar237 = local_268 * fVar169 +
                    local_2f8 * fVar151 + fVar259 * fVar172 + local_2e8 * fVar206;
          fVar238 = fStack_264 * fVar75 +
                    fStack_2f4 * fVar153 + fVar259 * fVar189 + fStack_2e4 * fVar208;
          fVar240 = fStack_260 * fVar113 +
                    fStack_2f0 * fVar156 + fVar259 * fVar192 + fStack_2e0 * fVar236;
          fVar245 = fStack_25c * fVar119 +
                    fStack_2ec * fVar167 + fVar259 * fVar197 + fStack_2dc * fVar239;
          fVar247 = local_278 * fVar169 +
                    local_348 * fVar151 + fVar267 * fVar172 + fVar115 * fVar206;
          fVar250 = fStack_274 * fVar75 +
                    fStack_344 * fVar153 + fVar267 * fVar189 + fVar115 * fVar208;
          fVar260 = fStack_270 * fVar113 +
                    fStack_340 * fVar156 + fVar267 * fVar192 + fVar115 * fVar236;
          fVar335 = fStack_26c * fVar119 +
                    fStack_33c * fVar167 + fVar267 * fVar197 + fVar115 * fVar239;
          auVar311._0_4_ =
               local_148 * fVar169 + local_138 * fVar151 + local_118 * fVar172 + local_128 * fVar206
          ;
          auVar311._4_4_ =
               fStack_144 * fVar75 +
               fStack_134 * fVar153 + fStack_114 * fVar189 + fStack_124 * fVar208;
          auVar311._8_4_ =
               fStack_140 * fVar113 +
               fStack_130 * fVar156 + fStack_110 * fVar192 + fStack_120 * fVar236;
          auVar311._12_4_ =
               fStack_13c * fVar119 +
               fStack_12c * fVar167 + fStack_10c * fVar197 + fStack_11c * fVar239;
          pfVar1 = (float *)(catmullrom_basis1 + lVar22 + lVar64 * 4);
          fVar151 = *pfVar1;
          fVar153 = pfVar1[1];
          fVar156 = pfVar1[2];
          fVar244 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2232c10 + lVar64 * 4);
          fVar246 = *pfVar1;
          fVar249 = pfVar1[1];
          fVar257 = pfVar1[2];
          fVar274 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233094 + lVar64 * 4);
          fVar276 = *pfVar1;
          fVar319 = pfVar1[1];
          fVar262 = pfVar1[2];
          fVar265 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233518 + lVar64 * 4);
          fVar266 = *pfVar1;
          fVar279 = pfVar1[1];
          fVar288 = pfVar1[2];
          fVar290 = pfVar1[3];
          fVar195 = local_268 * fVar151 +
                    local_2f8 * fVar246 + fVar259 * fVar276 + local_2e8 * fVar266;
          fVar196 = fStack_264 * fVar153 +
                    fStack_2f4 * fVar249 + fVar259 * fVar319 + fStack_2e4 * fVar279;
          fVar198 = fStack_260 * fVar156 +
                    fStack_2f0 * fVar257 + fVar259 * fVar262 + fStack_2e0 * fVar288;
          fVar207 = fStack_25c * fVar244 +
                    fStack_2ec * fVar274 + fVar259 * fVar265 + fStack_2dc * fVar290;
          fVar209 = local_278 * fVar151 +
                    local_348 * fVar246 + fVar267 * fVar276 + fVar115 * fVar266;
          fVar210 = fStack_274 * fVar153 +
                    fStack_344 * fVar249 + fVar267 * fVar319 + fVar115 * fVar279;
          fVar212 = fStack_270 * fVar156 +
                    fStack_340 * fVar257 + fVar267 * fVar262 + fVar115 * fVar288;
          fVar235 = fStack_26c * fVar244 +
                    fStack_33c * fVar274 + fVar267 * fVar265 + fVar115 * fVar290;
          auVar323._0_4_ =
               local_148 * fVar151 + local_138 * fVar246 + local_118 * fVar276 + local_128 * fVar266
          ;
          auVar323._4_4_ =
               fStack_144 * fVar153 +
               fStack_134 * fVar249 + fStack_114 * fVar319 + fStack_124 * fVar279;
          auVar323._8_4_ =
               fStack_140 * fVar156 +
               fStack_130 * fVar257 + fStack_110 * fVar262 + fStack_120 * fVar288;
          auVar323._12_4_ =
               fStack_13c * fVar244 +
               fStack_12c * fVar274 + fStack_10c * fVar265 + fStack_11c * fVar290;
          fVar190 = fVar195 - fVar237;
          fVar191 = fVar196 - fVar238;
          fVar193 = fVar198 - fVar240;
          fVar194 = fVar207 - fVar245;
          fVar326 = fVar209 - fVar247;
          fVar327 = fVar210 - fVar250;
          fVar328 = fVar212 - fVar260;
          fVar173 = fVar235 - fVar335;
          fVar248 = fVar247 * fVar190 - fVar237 * fVar326;
          fVar258 = fVar250 * fVar191 - fVar238 * fVar327;
          fVar261 = fVar260 * fVar193 - fVar240 * fVar328;
          fVar337 = fVar335 * fVar194 - fVar245 * fVar173;
          auVar77 = maxps(auVar311,auVar323);
          bVar49 = fVar248 * fVar248 <=
                   auVar77._0_4_ * auVar77._0_4_ * (fVar190 * fVar190 + fVar326 * fVar326) &&
                   (int)uVar68 < local_58;
          auVar256._0_4_ = -(uint)bVar49;
          bVar50 = fVar258 * fVar258 <=
                   auVar77._4_4_ * auVar77._4_4_ * (fVar191 * fVar191 + fVar327 * fVar327) &&
                   (int)(uVar68 | 1) < iStack_54;
          auVar256._4_4_ = -(uint)bVar50;
          bVar51 = fVar261 * fVar261 <=
                   auVar77._8_4_ * auVar77._8_4_ * (fVar193 * fVar193 + fVar328 * fVar328) &&
                   (int)(uVar68 | 2) < iStack_50;
          auVar256._8_4_ = -(uint)bVar51;
          bVar52 = fVar337 * fVar337 <=
                   auVar77._12_4_ * auVar77._12_4_ * (fVar194 * fVar194 + fVar173 * fVar173) &&
                   (int)(uVar68 | 3) < iStack_4c;
          auVar256._12_4_ = -(uint)bVar52;
          uVar71 = movmskps((int)uVar63,auVar256);
          uVar63 = (ulong)uVar71;
          if (uVar71 != 0) {
            fVar337 = fVar266 * local_258 + fVar276 * local_248 + fVar246 * fVar234 +
                      fVar151 * fVar211;
            fVar339 = fVar279 * fStack_254 + fVar319 * fStack_244 + fVar249 * fVar234 +
                      fVar153 * fVar211;
            fVar341 = fVar288 * fStack_250 + fVar262 * fStack_240 + fVar257 * fVar234 +
                      fVar156 * fVar211;
            fVar275 = fVar290 * fStack_24c + fVar265 * fStack_23c + fVar274 * fVar234 +
                      fVar244 * fVar211;
            local_308._0_4_ = auVar28._0_4_;
            local_308._4_4_ = auVar28._4_4_;
            fStack_300 = auVar28._8_4_;
            fVar316 = fVar206 * local_258 + fVar172 * local_248 + (float)local_308._0_4_ * fVar234 +
                      fVar169 * fVar211;
            fVar318 = fVar208 * fStack_254 + fVar189 * fStack_244 + (float)local_308._4_4_ * fVar234
                      + fVar75 * fVar211;
            fVar76 = fVar236 * fStack_250 + fVar192 * fStack_240 + fStack_300 * fVar234 +
                     fVar113 * fVar211;
            fVar114 = fVar239 * fStack_24c + fVar197 * fStack_23c + fVar167 * fVar234 +
                      fVar119 * fVar211;
            pfVar1 = (float *)(lVar22 + 0x223157c + lVar64 * 4);
            fVar169 = *pfVar1;
            fVar75 = pfVar1[1];
            fVar113 = pfVar1[2];
            fVar119 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231a00 + lVar64 * 4);
            fVar151 = *pfVar1;
            fVar153 = pfVar1[1];
            fVar156 = pfVar1[2];
            fVar167 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231e84 + lVar64 * 4);
            fVar172 = *pfVar1;
            fVar189 = pfVar1[1];
            fVar192 = pfVar1[2];
            fVar197 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2232308 + lVar64 * 4);
            fVar206 = *pfVar1;
            fVar208 = pfVar1[1];
            fVar236 = pfVar1[2];
            fVar239 = pfVar1[3];
            fVar116 = local_268 * fVar169 +
                      local_2f8 * fVar151 + fVar259 * fVar172 + local_2e8 * fVar206;
            fVar118 = fStack_264 * fVar75 +
                      fStack_2f4 * fVar153 + fVar259 * fVar189 + fStack_2e4 * fVar208;
            fVar120 = fStack_260 * fVar113 +
                      fStack_2f0 * fVar156 + fVar259 * fVar192 + fStack_2e0 * fVar236;
            fVar152 = fStack_25c * fVar119 +
                      fStack_2ec * fVar167 + fVar259 * fVar197 + fStack_2dc * fVar239;
            fVar277 = local_278 * fVar169 +
                      local_348 * fVar151 + fVar267 * fVar172 + fVar115 * fVar206;
            fVar278 = fStack_274 * fVar75 +
                      fStack_344 * fVar153 + fVar267 * fVar189 + fVar115 * fVar208;
            fVar304 = fStack_270 * fVar113 +
                      fStack_340 * fVar156 + fVar267 * fVar192 + fVar115 * fVar236;
            fVar314 = fStack_26c * fVar119 +
                      fStack_33c * fVar167 + fVar267 * fVar197 + fVar115 * fVar239;
            pfVar1 = (float *)(lVar22 + 0x223399c + lVar64 * 4);
            fVar244 = *pfVar1;
            fVar246 = pfVar1[1];
            fVar249 = pfVar1[2];
            fVar257 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x22342a4 + lVar64 * 4);
            fVar274 = *pfVar1;
            fVar276 = pfVar1[1];
            fVar319 = pfVar1[2];
            fVar262 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2234728 + lVar64 * 4);
            fVar265 = *pfVar1;
            fVar266 = pfVar1[1];
            fVar279 = pfVar1[2];
            fVar288 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2233e20 + lVar64 * 4);
            fVar290 = *pfVar1;
            fVar248 = pfVar1[1];
            fVar258 = pfVar1[2];
            fVar261 = pfVar1[3];
            fVar154 = local_268 * fVar244 +
                      local_2f8 * fVar290 + fVar259 * fVar274 + local_2e8 * fVar265;
            fVar155 = fStack_264 * fVar246 +
                      fStack_2f4 * fVar248 + fVar259 * fVar276 + fStack_2e4 * fVar266;
            fVar157 = fStack_260 * fVar249 +
                      fStack_2f0 * fVar258 + fVar259 * fVar319 + fStack_2e0 * fVar279;
            fVar168 = fStack_25c * fVar257 +
                      fStack_2ec * fVar261 + fVar259 * fVar262 + fStack_2dc * fVar288;
            fVar170 = local_278 * fVar244 +
                      local_348 * fVar290 + fVar267 * fVar274 + fVar115 * fVar265;
            fVar171 = fStack_274 * fVar246 +
                      fStack_344 * fVar248 + fVar267 * fVar276 + fVar115 * fVar266;
            fVar280 = fStack_270 * fVar249 +
                      fStack_340 * fVar258 + fVar267 * fVar319 + fVar115 * fVar279;
            fVar289 = fStack_26c * fVar257 +
                      fStack_33c * fVar261 + fVar267 * fVar262 + fVar115 * fVar288;
            auVar312._0_8_ = CONCAT44(fVar118,fVar116) & 0x7fffffff7fffffff;
            auVar312._8_4_ = ABS(fVar120);
            auVar312._12_4_ = ABS(fVar152);
            auVar231._0_8_ = CONCAT44(fVar278,fVar277) & 0x7fffffff7fffffff;
            auVar231._8_4_ = ABS(fVar304);
            auVar231._12_4_ = ABS(fVar314);
            auVar77 = maxps(auVar312,auVar231);
            auVar324._0_8_ =
                 CONCAT44(fVar75 * fVar211 +
                          fVar153 * fVar234 + fVar189 * fStack_244 + fVar208 * fStack_254,
                          fVar169 * fVar211 +
                          fVar151 * fVar234 + fVar172 * local_248 + fVar206 * local_258) &
                 0x7fffffff7fffffff;
            auVar324._8_4_ =
                 ABS(fVar113 * fVar211 +
                     fVar156 * fVar234 + fVar192 * fStack_240 + fVar236 * fStack_250);
            auVar324._12_4_ =
                 ABS(fVar119 * fVar211 +
                     fVar167 * fVar234 + fVar197 * fStack_23c + fVar239 * fStack_24c);
            auVar77 = maxps(auVar77,auVar324);
            uVar71 = -(uint)(local_448 <= auVar77._0_4_);
            uVar70 = -(uint)(local_448 <= auVar77._4_4_);
            uVar72 = -(uint)(local_448 <= auVar77._8_4_);
            uVar73 = -(uint)(local_448 <= auVar77._12_4_);
            auVar232._0_4_ = ~uVar71 & (uint)fVar190;
            auVar232._4_4_ = ~uVar70 & (uint)fVar191;
            auVar232._8_4_ = ~uVar72 & (uint)fVar193;
            auVar232._12_4_ = ~uVar73 & (uint)fVar194;
            auVar299._0_4_ = (uint)fVar116 & uVar71;
            auVar299._4_4_ = (uint)fVar118 & uVar70;
            auVar299._8_4_ = (uint)fVar120 & uVar72;
            auVar299._12_4_ = (uint)fVar152 & uVar73;
            auVar299 = auVar299 | auVar232;
            fVar189 = (float)(~uVar71 & (uint)fVar326 | (uint)fVar277 & uVar71);
            fVar192 = (float)(~uVar70 & (uint)fVar327 | (uint)fVar278 & uVar70);
            fVar197 = (float)(~uVar72 & (uint)fVar328 | (uint)fVar304 & uVar72);
            fVar277 = (float)(~uVar73 & (uint)fVar173 | (uint)fVar314 & uVar73);
            auVar325._0_8_ = CONCAT44(fVar155,fVar154) & 0x7fffffff7fffffff;
            auVar325._8_4_ = ABS(fVar157);
            auVar325._12_4_ = ABS(fVar168);
            auVar161._0_8_ = CONCAT44(fVar171,fVar170) & 0x7fffffff7fffffff;
            auVar161._8_4_ = ABS(fVar280);
            auVar161._12_4_ = ABS(fVar289);
            auVar77 = maxps(auVar325,auVar161);
            auVar102._0_8_ =
                 CONCAT44(fVar246 * fVar211 +
                          fVar248 * fVar234 + fVar276 * fStack_244 + fVar266 * fStack_254,
                          fVar244 * fVar211 +
                          fVar290 * fVar234 + fVar274 * local_248 + fVar265 * local_258) &
                 0x7fffffff7fffffff;
            auVar102._8_4_ =
                 ABS(fVar249 * fVar211 +
                     fVar258 * fVar234 + fVar319 * fStack_240 + fVar279 * fStack_250);
            auVar102._12_4_ =
                 ABS(fVar257 * fVar211 +
                     fVar261 * fVar234 + fVar262 * fStack_23c + fVar288 * fStack_24c);
            auVar77 = maxps(auVar77,auVar102);
            uVar71 = -(uint)(local_448 <= auVar77._0_4_);
            uVar70 = -(uint)(local_448 <= auVar77._4_4_);
            uVar72 = -(uint)(local_448 <= auVar77._8_4_);
            uVar73 = -(uint)(local_448 <= auVar77._12_4_);
            fVar274 = (float)((uint)fVar154 & uVar71 | ~uVar71 & (uint)fVar190);
            fVar319 = (float)((uint)fVar155 & uVar70 | ~uVar70 & (uint)fVar191);
            fVar265 = (float)((uint)fVar157 & uVar72 | ~uVar72 & (uint)fVar193);
            fVar279 = (float)((uint)fVar168 & uVar73 | ~uVar73 & (uint)fVar194);
            fVar244 = (float)(~uVar71 & (uint)fVar326 | (uint)fVar170 & uVar71);
            fVar246 = (float)(~uVar70 & (uint)fVar327 | (uint)fVar171 & uVar70);
            fVar249 = (float)(~uVar72 & (uint)fVar328 | (uint)fVar280 & uVar72);
            fVar257 = (float)(~uVar73 & (uint)fVar173 | (uint)fVar289 & uVar73);
            fVar172 = auVar299._0_4_;
            fVar169 = auVar299._4_4_;
            fVar75 = auVar299._8_4_;
            fVar113 = auVar299._12_4_;
            auVar202._0_4_ = fVar189 * fVar189 + fVar172 * fVar172;
            auVar202._4_4_ = fVar192 * fVar192 + fVar169 * fVar169;
            auVar202._8_4_ = fVar197 * fVar197 + fVar75 * fVar75;
            auVar202._12_4_ = fVar277 * fVar277 + fVar113 * fVar113;
            auVar77 = rsqrtps(auVar232,auVar202);
            fVar119 = auVar77._0_4_;
            fVar151 = auVar77._4_4_;
            fVar153 = auVar77._8_4_;
            fVar156 = auVar77._12_4_;
            auVar233._0_4_ = fVar119 * fVar119 * auVar202._0_4_ * 0.5 * fVar119;
            auVar233._4_4_ = fVar151 * fVar151 * auVar202._4_4_ * 0.5 * fVar151;
            auVar233._8_4_ = fVar153 * fVar153 * auVar202._8_4_ * 0.5 * fVar153;
            auVar233._12_4_ = fVar156 * fVar156 * auVar202._12_4_ * 0.5 * fVar156;
            fVar206 = fVar119 * 1.5 - auVar233._0_4_;
            fVar208 = fVar151 * 1.5 - auVar233._4_4_;
            fVar236 = fVar153 * 1.5 - auVar233._8_4_;
            fVar239 = fVar156 * 1.5 - auVar233._12_4_;
            auVar203._0_4_ = fVar244 * fVar244 + fVar274 * fVar274;
            auVar203._4_4_ = fVar246 * fVar246 + fVar319 * fVar319;
            auVar203._8_4_ = fVar249 * fVar249 + fVar265 * fVar265;
            auVar203._12_4_ = fVar257 * fVar257 + fVar279 * fVar279;
            auVar77 = rsqrtps(auVar233,auVar203);
            fVar119 = auVar77._0_4_;
            fVar151 = auVar77._4_4_;
            fVar153 = auVar77._8_4_;
            fVar156 = auVar77._12_4_;
            fVar167 = fVar119 * 1.5 - fVar119 * fVar119 * auVar203._0_4_ * 0.5 * fVar119;
            fVar151 = fVar151 * 1.5 - fVar151 * fVar151 * auVar203._4_4_ * 0.5 * fVar151;
            fVar153 = fVar153 * 1.5 - fVar153 * fVar153 * auVar203._8_4_ * 0.5 * fVar153;
            fVar156 = fVar156 * 1.5 - fVar156 * fVar156 * auVar203._12_4_ * 0.5 * fVar156;
            fVar190 = fVar189 * fVar206 * auVar311._0_4_;
            fVar193 = fVar192 * fVar208 * auVar311._4_4_;
            fVar154 = fVar197 * fVar236 * auVar311._8_4_;
            fVar157 = fVar277 * fVar239 * auVar311._12_4_;
            fVar172 = -fVar172 * fVar206 * auVar311._0_4_;
            fVar189 = -fVar169 * fVar208 * auVar311._4_4_;
            fVar192 = -fVar75 * fVar236 * auVar311._8_4_;
            fVar197 = -fVar113 * fVar239 * auVar311._12_4_;
            fVar276 = fVar206 * 0.0 * auVar311._0_4_;
            fVar262 = fVar208 * 0.0 * auVar311._4_4_;
            fVar266 = fVar236 * 0.0 * auVar311._8_4_;
            fVar288 = fVar239 * 0.0 * auVar311._12_4_;
            fVar170 = fVar244 * fVar167 * auVar323._0_4_;
            fVar171 = fVar246 * fVar151 * auVar323._4_4_;
            fVar280 = fVar249 * fVar153 * auVar323._8_4_;
            fVar289 = fVar257 * fVar156 * auVar323._12_4_;
            fVar258 = fVar195 + fVar170;
            fVar261 = fVar196 + fVar171;
            fVar277 = fVar198 + fVar280;
            fVar278 = fVar207 + fVar289;
            fVar169 = -fVar274 * fVar167 * auVar323._0_4_;
            fVar75 = -fVar319 * fVar151 * auVar323._4_4_;
            fVar113 = -fVar265 * fVar153 * auVar323._8_4_;
            fVar119 = -fVar279 * fVar156 * auVar323._12_4_;
            fVar304 = fVar209 + fVar169;
            fVar314 = fVar210 + fVar75;
            fVar116 = fVar212 + fVar113;
            fVar118 = fVar235 + fVar119;
            fVar208 = fVar167 * 0.0 * auVar323._0_4_;
            fVar239 = fVar151 * 0.0 * auVar323._4_4_;
            fVar246 = fVar153 * 0.0 * auVar323._8_4_;
            fVar257 = fVar156 * 0.0 * auVar323._12_4_;
            fVar274 = fVar237 - fVar190;
            fVar319 = fVar238 - fVar193;
            fVar265 = fVar240 - fVar154;
            fVar279 = fVar245 - fVar157;
            fVar120 = fVar337 + fVar208;
            fVar152 = fVar339 + fVar239;
            fVar155 = fVar341 + fVar246;
            fVar168 = fVar275 + fVar257;
            fVar290 = fVar247 - fVar172;
            fVar191 = fVar250 - fVar189;
            fVar194 = fVar260 - fVar192;
            fVar248 = fVar335 - fVar197;
            fVar206 = fVar316 - fVar276;
            fVar236 = fVar318 - fVar262;
            fVar244 = fVar76 - fVar266;
            fVar249 = fVar114 - fVar288;
            uVar71 = -(uint)(0.0 < (fVar290 * (fVar120 - fVar206) - fVar206 * (fVar304 - fVar290)) *
                                   0.0 + (fVar206 * (fVar258 - fVar274) -
                                         (fVar120 - fVar206) * fVar274) * 0.0 +
                                         ((fVar304 - fVar290) * fVar274 -
                                         (fVar258 - fVar274) * fVar290));
            uVar70 = -(uint)(0.0 < (fVar191 * (fVar152 - fVar236) - fVar236 * (fVar314 - fVar191)) *
                                   0.0 + (fVar236 * (fVar261 - fVar319) -
                                         (fVar152 - fVar236) * fVar319) * 0.0 +
                                         ((fVar314 - fVar191) * fVar319 -
                                         (fVar261 - fVar319) * fVar191));
            uVar72 = -(uint)(0.0 < (fVar194 * (fVar155 - fVar244) - fVar244 * (fVar116 - fVar194)) *
                                   0.0 + (fVar244 * (fVar277 - fVar265) -
                                         (fVar155 - fVar244) * fVar265) * 0.0 +
                                         ((fVar116 - fVar194) * fVar265 -
                                         (fVar277 - fVar265) * fVar194));
            uVar73 = -(uint)(0.0 < (fVar248 * (fVar168 - fVar249) - fVar249 * (fVar118 - fVar248)) *
                                   0.0 + (fVar249 * (fVar278 - fVar279) -
                                         (fVar168 - fVar249) * fVar279) * 0.0 +
                                         ((fVar118 - fVar248) * fVar279 -
                                         (fVar278 - fVar279) * fVar248));
            fVar151 = (float)((uint)(fVar195 - fVar170) & uVar71 |
                             ~uVar71 & (uint)(fVar237 + fVar190));
            fVar153 = (float)((uint)(fVar196 - fVar171) & uVar70 |
                             ~uVar70 & (uint)(fVar238 + fVar193));
            fVar156 = (float)((uint)(fVar198 - fVar280) & uVar72 |
                             ~uVar72 & (uint)(fVar240 + fVar154));
            fVar167 = (float)((uint)(fVar207 - fVar289) & uVar73 |
                             ~uVar73 & (uint)(fVar245 + fVar157));
            fVar245 = (float)((uint)(fVar209 - fVar169) & uVar71 |
                             ~uVar71 & (uint)(fVar247 + fVar172));
            fVar247 = (float)((uint)(fVar210 - fVar75) & uVar70 |
                             ~uVar70 & (uint)(fVar250 + fVar189));
            fVar250 = (float)((uint)(fVar212 - fVar113) & uVar72 |
                             ~uVar72 & (uint)(fVar260 + fVar192));
            fVar260 = (float)((uint)(fVar235 - fVar119) & uVar73 |
                             ~uVar73 & (uint)(fVar335 + fVar197));
            fVar198 = (float)((uint)(fVar337 - fVar208) & uVar71 |
                             ~uVar71 & (uint)(fVar316 + fVar276));
            fVar207 = (float)((uint)(fVar339 - fVar239) & uVar70 |
                             ~uVar70 & (uint)(fVar318 + fVar262));
            fVar209 = (float)((uint)(fVar341 - fVar246) & uVar72 |
                             ~uVar72 & (uint)(fVar76 + fVar266));
            fVar210 = (float)((uint)(fVar275 - fVar257) & uVar73 |
                             ~uVar73 & (uint)(fVar114 + fVar288));
            fVar276 = (float)((uint)fVar274 & uVar71 | ~uVar71 & (uint)fVar258);
            fVar262 = (float)((uint)fVar319 & uVar70 | ~uVar70 & (uint)fVar261);
            fVar266 = (float)((uint)fVar265 & uVar72 | ~uVar72 & (uint)fVar277);
            fVar288 = (float)((uint)fVar279 & uVar73 | ~uVar73 & (uint)fVar278);
            fVar190 = (float)((uint)fVar290 & uVar71 | ~uVar71 & (uint)fVar304);
            fVar193 = (float)((uint)fVar191 & uVar70 | ~uVar70 & (uint)fVar314);
            fVar195 = (float)((uint)fVar194 & uVar72 | ~uVar72 & (uint)fVar116);
            fVar196 = (float)((uint)fVar248 & uVar73 | ~uVar73 & (uint)fVar118);
            fVar208 = (float)((uint)fVar206 & uVar71 | ~uVar71 & (uint)fVar120);
            fVar239 = (float)((uint)fVar236 & uVar70 | ~uVar70 & (uint)fVar152);
            fVar246 = (float)((uint)fVar244 & uVar72 | ~uVar72 & (uint)fVar155);
            fVar257 = (float)((uint)fVar249 & uVar73 | ~uVar73 & (uint)fVar168);
            fVar274 = (float)((uint)fVar258 & uVar71 | ~uVar71 & (uint)fVar274) - fVar151;
            fVar319 = (float)((uint)fVar261 & uVar70 | ~uVar70 & (uint)fVar319) - fVar153;
            fVar265 = (float)((uint)fVar277 & uVar72 | ~uVar72 & (uint)fVar265) - fVar156;
            fVar279 = (float)((uint)fVar278 & uVar73 | ~uVar73 & (uint)fVar279) - fVar167;
            fVar290 = (float)((uint)fVar304 & uVar71 | ~uVar71 & (uint)fVar290) - fVar245;
            fVar191 = (float)((uint)fVar314 & uVar70 | ~uVar70 & (uint)fVar191) - fVar247;
            fVar194 = (float)((uint)fVar116 & uVar72 | ~uVar72 & (uint)fVar194) - fVar250;
            fVar212 = (float)((uint)fVar118 & uVar73 | ~uVar73 & (uint)fVar248) - fVar260;
            fVar206 = (float)((uint)fVar120 & uVar71 | ~uVar71 & (uint)fVar206) - fVar198;
            fVar236 = (float)((uint)fVar152 & uVar70 | ~uVar70 & (uint)fVar236) - fVar207;
            fVar244 = (float)((uint)fVar155 & uVar72 | ~uVar72 & (uint)fVar244) - fVar209;
            fVar249 = (float)((uint)fVar168 & uVar73 | ~uVar73 & (uint)fVar249) - fVar210;
            fVar248 = fVar151 - fVar276;
            fVar258 = fVar153 - fVar262;
            fVar261 = fVar156 - fVar266;
            fVar335 = fVar167 - fVar288;
            fVar169 = fVar245 - fVar190;
            fVar75 = fVar247 - fVar193;
            fVar113 = fVar250 - fVar195;
            fVar119 = fVar260 - fVar196;
            fVar172 = fVar198 - fVar208;
            fVar189 = fVar207 - fVar239;
            fVar192 = fVar209 - fVar246;
            fVar197 = fVar210 - fVar257;
            fVar235 = (fVar245 * fVar206 - fVar198 * fVar290) * 0.0 +
                      (fVar198 * fVar274 - fVar151 * fVar206) * 0.0 +
                      (fVar151 * fVar290 - fVar245 * fVar274);
            fVar237 = (fVar247 * fVar236 - fVar207 * fVar191) * 0.0 +
                      (fVar207 * fVar319 - fVar153 * fVar236) * 0.0 +
                      (fVar153 * fVar191 - fVar247 * fVar319);
            auVar184._4_4_ = fVar237;
            auVar184._0_4_ = fVar235;
            fVar238 = (fVar250 * fVar244 - fVar209 * fVar194) * 0.0 +
                      (fVar209 * fVar265 - fVar156 * fVar244) * 0.0 +
                      (fVar156 * fVar194 - fVar250 * fVar265);
            fVar240 = (fVar260 * fVar249 - fVar210 * fVar212) * 0.0 +
                      (fVar210 * fVar279 - fVar167 * fVar249) * 0.0 +
                      (fVar167 * fVar212 - fVar260 * fVar279);
            auVar331._0_4_ =
                 (fVar190 * fVar172 - fVar208 * fVar169) * 0.0 +
                 (fVar208 * fVar248 - fVar276 * fVar172) * 0.0 +
                 (fVar276 * fVar169 - fVar190 * fVar248);
            auVar331._4_4_ =
                 (fVar193 * fVar189 - fVar239 * fVar75) * 0.0 +
                 (fVar239 * fVar258 - fVar262 * fVar189) * 0.0 +
                 (fVar262 * fVar75 - fVar193 * fVar258);
            auVar331._8_4_ =
                 (fVar195 * fVar192 - fVar246 * fVar113) * 0.0 +
                 (fVar246 * fVar261 - fVar266 * fVar192) * 0.0 +
                 (fVar266 * fVar113 - fVar195 * fVar261);
            auVar331._12_4_ =
                 (fVar196 * fVar197 - fVar257 * fVar119) * 0.0 +
                 (fVar257 * fVar335 - fVar288 * fVar197) * 0.0 +
                 (fVar288 * fVar119 - fVar196 * fVar335);
            auVar184._8_4_ = fVar238;
            auVar184._12_4_ = fVar240;
            auVar77 = maxps(auVar184,auVar331);
            bVar49 = auVar77._0_4_ <= 0.0 && bVar49;
            auVar185._0_4_ = -(uint)bVar49;
            bVar50 = auVar77._4_4_ <= 0.0 && bVar50;
            auVar185._4_4_ = -(uint)bVar50;
            bVar51 = auVar77._8_4_ <= 0.0 && bVar51;
            auVar185._8_4_ = -(uint)bVar51;
            bVar52 = auVar77._12_4_ <= 0.0 && bVar52;
            auVar185._12_4_ = -(uint)bVar52;
            iVar53 = movmskps((int)(catmullrom_basis1 + lVar22),auVar185);
            if (iVar53 == 0) {
LAB_00c2e5d1:
              auVar163._8_8_ = uStack_360;
              auVar163._0_8_ = local_368;
            }
            else {
              fVar208 = fVar169 * fVar206 - fVar172 * fVar290;
              fVar239 = fVar75 * fVar236 - fVar189 * fVar191;
              fVar246 = fVar113 * fVar244 - fVar192 * fVar194;
              fVar257 = fVar119 * fVar249 - fVar197 * fVar212;
              fVar206 = fVar172 * fVar274 - fVar206 * fVar248;
              fVar189 = fVar189 * fVar319 - fVar236 * fVar258;
              fVar192 = fVar192 * fVar265 - fVar244 * fVar261;
              fVar197 = fVar197 * fVar279 - fVar249 * fVar335;
              fVar169 = fVar248 * fVar290 - fVar169 * fVar274;
              fVar236 = fVar258 * fVar191 - fVar75 * fVar319;
              fVar244 = fVar261 * fVar194 - fVar113 * fVar265;
              fVar249 = fVar335 * fVar212 - fVar119 * fVar279;
              auVar162._0_4_ = fVar206 * 0.0 + fVar169;
              auVar162._4_4_ = fVar189 * 0.0 + fVar236;
              auVar162._8_4_ = fVar192 * 0.0 + fVar244;
              auVar162._12_4_ = fVar197 * 0.0 + fVar249;
              auVar243._0_4_ = fVar208 * 0.0 + auVar162._0_4_;
              auVar243._4_4_ = fVar239 * 0.0 + auVar162._4_4_;
              auVar243._8_4_ = fVar246 * 0.0 + auVar162._8_4_;
              auVar243._12_4_ = fVar257 * 0.0 + auVar162._12_4_;
              auVar77 = rcpps(auVar162,auVar243);
              fVar75 = auVar77._0_4_;
              fVar113 = auVar77._4_4_;
              fVar119 = auVar77._8_4_;
              fVar172 = auVar77._12_4_;
              fVar75 = (1.0 - auVar243._0_4_ * fVar75) * fVar75 + fVar75;
              fVar113 = (1.0 - auVar243._4_4_ * fVar113) * fVar113 + fVar113;
              fVar119 = (1.0 - auVar243._8_4_ * fVar119) * fVar119 + fVar119;
              fVar172 = (1.0 - auVar243._12_4_ * fVar172) * fVar172 + fVar172;
              fVar151 = (fVar198 * fVar169 + fVar245 * fVar206 + fVar151 * fVar208) * fVar75;
              fVar153 = (fVar207 * fVar236 + fVar247 * fVar189 + fVar153 * fVar239) * fVar113;
              fVar156 = (fVar209 * fVar244 + fVar250 * fVar192 + fVar156 * fVar246) * fVar119;
              fVar167 = (fVar210 * fVar249 + fVar260 * fVar197 + fVar167 * fVar257) * fVar172;
              fVar169 = *(float *)(ray + k * 4 + 0x80);
              bVar49 = ((float)local_288._0_4_ <= fVar151 && fVar151 <= fVar169) && bVar49;
              auVar204._0_4_ = -(uint)bVar49;
              bVar50 = ((float)local_288._4_4_ <= fVar153 && fVar153 <= fVar169) && bVar50;
              auVar204._4_4_ = -(uint)bVar50;
              bVar51 = (fStack_280 <= fVar156 && fVar156 <= fVar169) && bVar51;
              auVar204._8_4_ = -(uint)bVar51;
              bVar52 = (fStack_27c <= fVar167 && fVar167 <= fVar169) && bVar52;
              auVar204._12_4_ = -(uint)bVar52;
              iVar53 = movmskps(iVar53,auVar204);
              if (iVar53 == 0) goto LAB_00c2e5d1;
              auVar205._0_8_ =
                   CONCAT44(-(uint)(auVar243._4_4_ != 0.0 && bVar50),
                            -(uint)(auVar243._0_4_ != 0.0 && bVar49));
              auVar205._8_4_ = -(uint)(auVar243._8_4_ != 0.0 && bVar51);
              auVar205._12_4_ = -(uint)(auVar243._12_4_ != 0.0 && bVar52);
              iVar53 = movmskps(iVar53,auVar205);
              auVar163._8_8_ = uStack_360;
              auVar163._0_8_ = local_368;
              if (iVar53 != 0) {
                fVar235 = fVar235 * fVar75;
                fVar237 = fVar237 * fVar113;
                fVar238 = fVar238 * fVar119;
                fVar240 = fVar240 * fVar172;
                local_3f8 = (float)((uint)(1.0 - fVar235) & uVar71 | ~uVar71 & (uint)fVar235);
                fStack_3f4 = (float)((uint)(1.0 - fVar237) & uVar70 | ~uVar70 & (uint)fVar237);
                fStack_3f0 = (float)((uint)(1.0 - fVar238) & uVar72 | ~uVar72 & (uint)fVar238);
                fStack_3ec = (float)((uint)(1.0 - fVar240) & uVar73 | ~uVar73 & (uint)fVar240);
                local_408 = (float)(~uVar71 & (uint)(auVar331._0_4_ * fVar75) |
                                   (uint)(1.0 - auVar331._0_4_ * fVar75) & uVar71);
                fStack_404 = (float)(~uVar70 & (uint)(auVar331._4_4_ * fVar113) |
                                    (uint)(1.0 - auVar331._4_4_ * fVar113) & uVar70);
                fStack_400 = (float)(~uVar72 & (uint)(auVar331._8_4_ * fVar119) |
                                    (uint)(1.0 - auVar331._8_4_ * fVar119) & uVar72);
                fStack_3fc = (float)(~uVar73 & (uint)(auVar331._12_4_ * fVar172) |
                                    (uint)(1.0 - auVar331._12_4_ * fVar172) & uVar73);
                auVar163._8_4_ = auVar205._8_4_;
                auVar163._0_8_ = auVar205._0_8_;
                auVar163._12_4_ = auVar205._12_4_;
                local_4f8 = fVar151;
                fStack_4f4 = fVar153;
                fStack_4f0 = fVar156;
                fStack_4ec = fVar167;
              }
            }
            iVar53 = movmskps(iVar53,auVar163);
            local_228 = fVar326;
            fStack_224 = fVar327;
            fStack_220 = fVar328;
            fStack_21c = fVar173;
            if (iVar53 != 0) {
              fVar75 = (auVar323._0_4_ - auVar311._0_4_) * local_3f8 + auVar311._0_4_;
              fVar113 = (auVar323._4_4_ - auVar311._4_4_) * fStack_3f4 + auVar311._4_4_;
              fVar119 = (auVar323._8_4_ - auVar311._8_4_) * fStack_3f0 + auVar311._8_4_;
              fVar151 = (auVar323._12_4_ - auVar311._12_4_) * fStack_3ec + auVar311._12_4_;
              fVar169 = *(float *)((long)local_370->ray_space + k * 4 + -0x10);
              auVar103._0_4_ = -(uint)(fVar169 * (fVar75 + fVar75) < local_4f8) & auVar163._0_4_;
              auVar103._4_4_ = -(uint)(fVar169 * (fVar113 + fVar113) < fStack_4f4) & auVar163._4_4_;
              auVar103._8_4_ = -(uint)(fVar169 * (fVar119 + fVar119) < fStack_4f0) & auVar163._8_4_;
              auVar103._12_4_ =
                   -(uint)(fVar169 * (fVar151 + fVar151) < fStack_4ec) & auVar163._12_4_;
              iVar53 = movmskps((int)local_370,auVar103);
              if (iVar53 != 0) {
                local_408 = local_408 + local_408 + -1.0;
                fStack_404 = fStack_404 + fStack_404 + -1.0;
                fStack_400 = fStack_400 + fStack_400 + -1.0;
                fStack_3fc = fStack_3fc + fStack_3fc + -1.0;
                local_1c8 = CONCAT44(fStack_354,local_358);
                uStack_1c0 = CONCAT44(fStack_34c,fStack_350);
                local_1b8 = CONCAT44(fStack_2a4,local_2a8);
                uStack_1b0 = CONCAT44(fStack_29c,fStack_2a0);
                local_1a8 = CONCAT44(fStack_2b4,local_2b8);
                uStack_1a0 = CONCAT44(fStack_2ac,fStack_2b0);
                local_198 = CONCAT44(fStack_294,local_298);
                uStack_190 = CONCAT44(fStack_28c,fStack_290);
                pGVar19 = (context->scene->geometries).items[(long)pRVar62].ptr;
                pRVar60 = pRVar62;
                local_208 = local_3f8;
                fStack_204 = fStack_3f4;
                fStack_200 = fStack_3f0;
                fStack_1fc = fStack_3ec;
                local_1f8 = local_408;
                fStack_1f4 = fStack_404;
                fStack_1f0 = fStack_400;
                fStack_1ec = fStack_3fc;
                local_1e8 = local_4f8;
                fStack_1e4 = fStack_4f4;
                fStack_1e0 = fStack_4f0;
                fStack_1dc = fStack_4ec;
                local_1d8 = uVar68;
                local_1d4 = iVar18;
                local_188 = auVar103;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar169 = (float)(int)uVar68;
                  local_178[0] = (fVar169 + local_3f8 + 0.0) * (float)local_2c8._0_4_;
                  local_178[1] = (fVar169 + fStack_3f4 + 1.0) * (float)local_2c8._4_4_;
                  local_178[2] = (fVar169 + fStack_3f0 + 2.0) * fStack_2c0;
                  local_178[3] = (fVar169 + fStack_3ec + 3.0) * fStack_2bc;
                  local_168 = CONCAT44(fStack_404,local_408);
                  uStack_160 = CONCAT44(fStack_3fc,fStack_400);
                  local_158[0] = local_4f8;
                  local_158[1] = fStack_4f4;
                  local_158[2] = fStack_4f0;
                  local_158[3] = fStack_4ec;
                  auVar140._0_4_ = auVar103._0_4_ & (uint)local_4f8;
                  auVar140._4_4_ = auVar103._4_4_ & (uint)fStack_4f4;
                  auVar140._8_4_ = auVar103._8_4_ & (uint)fStack_4f0;
                  auVar140._12_4_ = auVar103._12_4_ & (uint)fStack_4ec;
                  auVar164._0_8_ = CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
                  auVar164._8_4_ = ~auVar103._8_4_ & 0x7f800000;
                  auVar164._12_4_ = ~auVar103._12_4_ & 0x7f800000;
                  auVar164 = auVar164 | auVar140;
                  auVar186._4_4_ = auVar164._0_4_;
                  auVar186._0_4_ = auVar164._4_4_;
                  auVar186._8_4_ = auVar164._12_4_;
                  auVar186._12_4_ = auVar164._8_4_;
                  auVar77 = minps(auVar186,auVar164);
                  auVar141._0_8_ = auVar77._8_8_;
                  auVar141._8_4_ = auVar77._0_4_;
                  auVar141._12_4_ = auVar77._4_4_;
                  auVar77 = minps(auVar141,auVar77);
                  auVar142._0_8_ =
                       CONCAT44(-(uint)(auVar77._4_4_ == auVar164._4_4_) & auVar103._4_4_,
                                -(uint)(auVar77._0_4_ == auVar164._0_4_) & auVar103._0_4_);
                  auVar142._8_4_ = -(uint)(auVar77._8_4_ == auVar164._8_4_) & auVar103._8_4_;
                  auVar142._12_4_ = -(uint)(auVar77._12_4_ == auVar164._12_4_) & auVar103._12_4_;
                  iVar53 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar142);
                  auVar104 = auVar103;
                  if (iVar53 != 0) {
                    auVar104._8_4_ = auVar142._8_4_;
                    auVar104._0_8_ = auVar142._0_8_;
                    auVar104._12_4_ = auVar142._12_4_;
                  }
                  uVar71 = movmskps(iVar53,auVar104);
                  uVar63 = 0;
                  if (uVar71 != 0) {
                    for (; (uVar71 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                    }
                  }
                  local_398 = auVar103;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar169 = local_178[uVar63];
                    fVar75 = 1.0 - fVar169;
                    fVar119 = fVar169 * 3.0;
                    fVar151 = ((fVar119 + 2.0) * (fVar75 + fVar75) + fVar75 * -3.0 * fVar75) * 0.5;
                    fVar113 = (fVar75 * -2.0 * fVar169 + fVar169 * fVar169) * 0.5;
                    fVar119 = (fVar169 * fVar119 + (fVar119 + -5.0) * (fVar169 + fVar169)) * 0.5;
                    uVar59 = *(undefined4 *)((long)&local_168 + uVar63 * 4);
                    fVar75 = (fVar169 * (fVar75 + fVar75) - fVar75 * fVar75) * 0.5;
                    *(float *)(ray + k * 4 + 0x80) = local_158[uVar63];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar75 * local_358 +
                         fVar119 * local_2a8 + fVar151 * local_2b8 + fVar113 * local_298;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar75 * fStack_354 +
                         fVar119 * fStack_2a4 + fVar151 * fStack_2b4 + fVar113 * fStack_294;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar75 * fStack_350 +
                         fVar119 * fStack_2a0 + fVar151 * fStack_2b0 + fVar113 * fStack_290;
                    *(float *)(ray + k * 4 + 0xf0) = fVar169;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar59;
                    *(uint *)(ray + k * 4 + 0x110) = uVar69;
                    *(uint *)(ray + k * 4 + 0x120) = uVar67;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar60 = (RTCIntersectArguments *)context;
                  }
                  else {
                    uVar117 = *local_2d0;
                    uVar25 = local_2d0[1];
                    do {
                      local_d8 = local_178[uVar63];
                      uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_c8 = *(undefined4 *)((long)&local_168 + uVar63 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_158[uVar63];
                      fVar151 = 1.0 - local_d8;
                      fVar169 = local_d8 * 3.0;
                      fVar119 = ((fVar169 + 2.0) * (fVar151 + fVar151) + fVar151 * -3.0 * fVar151) *
                                0.5;
                      fVar75 = (local_d8 * local_d8 + fVar151 * -2.0 * local_d8) * 0.5;
                      fVar113 = (local_d8 * fVar169 + (fVar169 + -5.0) * (local_d8 + local_d8)) *
                                0.5;
                      local_338.context = context->user;
                      fVar169 = (local_d8 * (fVar151 + fVar151) - fVar151 * fVar151) * 0.5;
                      local_108._0_4_ =
                           fVar169 * local_358 +
                           fVar113 * fVar302 + fVar119 * fVar293 + fVar75 * fVar315;
                      local_f8 = fVar169 * fStack_354 +
                                 fVar113 * fVar303 + fVar119 * fVar300 + fVar75 * fVar317;
                      local_e8 = fVar169 * fStack_350 +
                                 fVar113 * fVar313 + fVar119 * fVar301 + fVar75 * fVar320;
                      local_108._4_4_ = local_108._0_4_;
                      local_108._8_4_ = local_108._0_4_;
                      fStack_fc = (float)local_108._0_4_;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      fStack_d4 = local_d8;
                      fStack_d0 = local_d8;
                      fStack_cc = local_d8;
                      uStack_c4 = local_c8;
                      uStack_c0 = local_c8;
                      uStack_bc = local_c8;
                      local_b8 = CONCAT44(uStack_74,local_78);
                      uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                      local_a8 = CONCAT44(uStack_64,local_68);
                      uStack_a0 = CONCAT44(uStack_5c,uStack_60);
                      local_98 = (local_338.context)->instID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_88 = (local_338.context)->instPrimID[0];
                      uStack_84 = local_88;
                      uStack_80 = local_88;
                      uStack_7c = local_88;
                      local_338.valid = (int *)&local_388;
                      pRVar60 = (RTCIntersectArguments *)pGVar19->userPtr;
                      local_338.hit = (RTCHitN *)local_108;
                      local_338.N = 4;
                      p_Var55 = pGVar19->intersectionFilterN;
                      local_388 = uVar117;
                      uStack_380 = uVar25;
                      local_338.geometryUserPtr = pRVar60;
                      local_338.ray = (RTCRayN *)ray;
                      if (p_Var55 != (RTCFilterFunctionN)0x0) {
                        p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_338);
                      }
                      auVar105._0_4_ = -(uint)((int)local_388 == 0);
                      auVar105._4_4_ = -(uint)(local_388._4_4_ == 0);
                      auVar105._8_4_ = -(uint)((int)uStack_380 == 0);
                      auVar105._12_4_ = -(uint)(uStack_380._4_4_ == 0);
                      uVar71 = movmskps((int)p_Var55,auVar105);
                      pRVar56 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                      if ((uVar71 ^ 0xf) == 0) {
                        auVar105 = auVar105 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar60 = context->args;
                        pRVar57 = (RTCIntersectArguments *)pRVar60->filter;
                        if ((pRVar57 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                            (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar57 = (RTCIntersectArguments *)(*(code *)pRVar57)(&local_338);
                        }
                        auVar143._0_4_ = -(uint)((int)local_388 == 0);
                        auVar143._4_4_ = -(uint)(local_388._4_4_ == 0);
                        auVar143._8_4_ = -(uint)((int)uStack_380 == 0);
                        auVar143._12_4_ = -(uint)(uStack_380._4_4_ == 0);
                        auVar105 = auVar143 ^ _DAT_01febe20;
                        uVar71 = movmskps((int)pRVar57,auVar143);
                        pRVar56 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                        if ((uVar71 ^ 0xf) != 0) {
                          RVar24 = *(RTCFeatureFlags *)((long)local_338.hit + 4);
                          uVar71 = *(uint *)((long)local_338.hit + 8);
                          uVar68 = *(uint *)((long)((long)local_338.hit + 8) + 4);
                          *(uint *)(local_338.ray + 0xc0) =
                               ~auVar143._0_4_ & *(uint *)&(local_338.hit)->field_0x0 |
                               *(uint *)(local_338.ray + 0xc0) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xc4) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xc4) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 200) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 200) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0xcc) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0xcc) & auVar143._12_4_;
                          RVar24 = *(RTCFeatureFlags *)((long)((long)local_338.hit + 0x10) + 4);
                          uVar71 = *(uint *)((long)local_338.hit + 0x18);
                          uVar68 = *(uint *)((long)((long)local_338.hit + 0x18) + 4);
                          *(uint *)(local_338.ray + 0xd0) =
                               ~auVar143._0_4_ & *(uint *)((long)local_338.hit + 0x10) |
                               *(uint *)(local_338.ray + 0xd0) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xd4) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xd4) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0xd8) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0xd8) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0xdc) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0xdc) & auVar143._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0xe0) =
                               ~auVar143._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->flags |
                               *(uint *)(local_338.ray + 0xe0) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xe4) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xe4) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0xe8) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0xe8) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0xec) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0xec) & auVar143._12_4_;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x20))->intersect + 4);
                          *(uint *)(local_338.ray + 0xf0) =
                               ~auVar143._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                         filter | *(uint *)(local_338.ray + 0xf0) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xf4) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xf4) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0xf8) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0xf8) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0xfc) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0xfc) & auVar143._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x100) =
                               ~auVar143._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->flags |
                               *(uint *)(local_338.ray + 0x100) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x104) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x104) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0x108) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0x108) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0x10c) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0x10c) & auVar143._12_4_;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x40))->intersect + 4);
                          *(uint *)(local_338.ray + 0x110) =
                               *(uint *)(local_338.ray + 0x110) & auVar143._0_4_ |
                               ~auVar143._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_338.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_338.ray + 0x114) & auVar143._4_4_ |
                               ~auVar143._4_4_ & RVar24;
                          *(uint *)(local_338.ray + 0x118) =
                               *(uint *)(local_338.ray + 0x118) & auVar143._8_4_ |
                               ~auVar143._8_4_ & uVar71;
                          *(uint *)(local_338.ray + 0x11c) =
                               *(uint *)(local_338.ray + 0x11c) & auVar143._12_4_ |
                               ~auVar143._12_4_ & uVar68;
                          RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x120) =
                               *(uint *)(local_338.ray + 0x120) & auVar143._0_4_ |
                               ~auVar143._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_338.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_338.ray + 0x124) & auVar143._4_4_ |
                               ~auVar143._4_4_ & RVar24;
                          *(uint *)(local_338.ray + 0x128) =
                               *(uint *)(local_338.ray + 0x128) & auVar143._8_4_ |
                               ~auVar143._8_4_ & uVar71;
                          *(uint *)(local_338.ray + 300) =
                               *(uint *)(local_338.ray + 300) & auVar143._12_4_ |
                               ~auVar143._12_4_ & uVar68;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x60))->intersect + 4);
                          *(uint *)(local_338.ray + 0x130) =
                               ~auVar143._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                         filter | *(uint *)(local_338.ray + 0x130) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x134) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x134) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0x138) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0x138) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0x13c) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0x13c) & auVar143._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x80))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x80))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x140) =
                               ~auVar143._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->flags |
                               *(uint *)(local_338.ray + 0x140) & auVar143._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x144) =
                               ~auVar143._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x144) & auVar143._4_4_;
                          *(uint *)(local_338.ray + 0x148) =
                               ~auVar143._8_4_ & uVar71 |
                               *(uint *)(local_338.ray + 0x148) & auVar143._8_4_;
                          *(uint *)(local_338.ray + 0x14c) =
                               ~auVar143._12_4_ & uVar68 |
                               *(uint *)(local_338.ray + 0x14c) & auVar143._12_4_;
                          pRVar56 = (RayHitK<4> *)local_338.ray;
                          pRVar60 = (RTCIntersectArguments *)local_338.hit;
                        }
                      }
                      auVar106._0_4_ = auVar105._0_4_ << 0x1f;
                      auVar106._4_4_ = auVar105._4_4_ << 0x1f;
                      auVar106._8_4_ = auVar105._8_4_ << 0x1f;
                      auVar106._12_4_ = auVar105._12_4_ << 0x1f;
                      iVar53 = movmskps((int)pRVar56,auVar106);
                      if (iVar53 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar59;
                      }
                      *(undefined4 *)(local_398 + uVar63 * 4) = 0;
                      fVar169 = *(float *)(ray + k * 4 + 0x80);
                      local_398._0_4_ = -(uint)(local_4f8 <= fVar169) & local_398._0_4_;
                      local_398._4_4_ = -(uint)(fStack_4f4 <= fVar169) & local_398._4_4_;
                      local_398._8_4_ = -(uint)(fStack_4f0 <= fVar169) & local_398._8_4_;
                      local_398._12_4_ = -(uint)(fStack_4ec <= fVar169) & local_398._12_4_;
                      iVar53 = movmskps(iVar53,local_398);
                      if (iVar53 != 0) {
                        auVar144._0_4_ = local_398._0_4_ & (uint)local_4f8;
                        auVar144._4_4_ = local_398._4_4_ & (uint)fStack_4f4;
                        auVar144._8_4_ = local_398._8_4_ & (uint)fStack_4f0;
                        auVar144._12_4_ = local_398._12_4_ & (uint)fStack_4ec;
                        auVar165._0_8_ =
                             CONCAT44(~local_398._4_4_,~local_398._0_4_) & 0x7f8000007f800000;
                        auVar165._8_4_ = ~local_398._8_4_ & 0x7f800000;
                        auVar165._12_4_ = ~local_398._12_4_ & 0x7f800000;
                        auVar165 = auVar165 | auVar144;
                        auVar187._4_4_ = auVar165._0_4_;
                        auVar187._0_4_ = auVar165._4_4_;
                        auVar187._8_4_ = auVar165._12_4_;
                        auVar187._12_4_ = auVar165._8_4_;
                        auVar77 = minps(auVar187,auVar165);
                        auVar145._0_8_ = auVar77._8_8_;
                        auVar145._8_4_ = auVar77._0_4_;
                        auVar145._12_4_ = auVar77._4_4_;
                        auVar77 = minps(auVar145,auVar77);
                        auVar146._0_8_ =
                             CONCAT44(-(uint)(auVar77._4_4_ == auVar165._4_4_) & local_398._4_4_,
                                      -(uint)(auVar77._0_4_ == auVar165._0_4_) & local_398._0_4_);
                        auVar146._8_4_ = -(uint)(auVar77._8_4_ == auVar165._8_4_) & local_398._8_4_;
                        auVar146._12_4_ =
                             -(uint)(auVar77._12_4_ == auVar165._12_4_) & local_398._12_4_;
                        iVar58 = movmskps((int)pRVar60,auVar146);
                        auVar107 = local_398;
                        if (iVar58 != 0) {
                          auVar107._8_4_ = auVar146._8_4_;
                          auVar107._0_8_ = auVar146._0_8_;
                          auVar107._12_4_ = auVar146._12_4_;
                        }
                        uVar59 = movmskps(iVar58,auVar107);
                        pRVar60 = (RTCIntersectArguments *)
                                  CONCAT44((int)((ulong)pRVar60 >> 0x20),uVar59);
                        uVar63 = 0;
                        if (pRVar60 != (RTCIntersectArguments *)0x0) {
                          for (; ((ulong)pRVar60 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar53 != '\0');
                  }
                }
              }
            }
          }
          uVar59 = SUB84(pRVar60,0);
          lVar64 = lVar64 + 4;
        } while ((int)lVar64 < iVar18);
      }
      fVar169 = *(float *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = -(uint)(fStack_44 <= fVar169);
      auVar139._0_4_ = -(uint)(local_48 <= fVar169);
      auVar139._8_4_ = -(uint)(fStack_40 <= fVar169);
      auVar139._12_4_ = -(uint)(fStack_3c <= fVar169);
      uVar67 = movmskps(uVar59,auVar139);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }